

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

void embree::avx2::CurveNiIntersectorK<8,8>::
     intersect_t<embree::avx2::RibbonCurve1IntersectorK<embree::CatmullRomCurveT,8,8>,embree::avx2::Intersect1KEpilogMU<8,8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  undefined1 (*pauVar1) [16];
  undefined1 (*pauVar2) [16];
  undefined1 (*pauVar3) [16];
  undefined1 (*pauVar4) [16];
  undefined1 (*pauVar5) [28];
  float *pfVar6;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar7;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  Primitive PVar16;
  uint uVar17;
  Geometry *pGVar18;
  RTCFilterFunctionN p_Var19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  long lVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  bool bVar85;
  bool bVar86;
  bool bVar87;
  bool bVar88;
  bool bVar89;
  bool bVar90;
  bool bVar91;
  bool bVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  undefined8 uVar100;
  undefined8 uVar101;
  undefined8 uVar102;
  undefined8 uVar103;
  undefined8 uVar104;
  undefined8 uVar105;
  undefined8 uVar106;
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [28];
  undefined1 auVar114 [24];
  uint uVar115;
  int iVar116;
  uint uVar117;
  ulong uVar118;
  uint uVar119;
  ulong uVar120;
  ulong uVar121;
  long lVar122;
  undefined1 auVar125 [16];
  undefined4 uVar123;
  undefined8 uVar124;
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar126 [16];
  undefined1 auVar140 [32];
  undefined1 auVar127 [16];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined8 extraout_XMM1_Qa;
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined8 extraout_XMM1_Qa_00;
  undefined1 auVar157 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [64];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  float fVar160;
  undefined1 auVar162 [16];
  float fVar161;
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [32];
  undefined1 auVar178 [32];
  undefined1 auVar171 [32];
  undefined1 auVar181 [64];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [32];
  float fVar203;
  float fVar204;
  float fVar205;
  float fVar206;
  float fVar207;
  float fVar208;
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar216 [64];
  undefined8 uVar217;
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [64];
  undefined1 auVar222 [64];
  undefined1 auVar223 [32];
  undefined1 auVar224 [64];
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  undefined1 auVar229 [64];
  undefined1 auVar230 [16];
  undefined1 auVar231 [32];
  undefined1 in_ZMM10 [64];
  undefined1 auVar232 [64];
  undefined4 uVar233;
  undefined1 auVar234 [16];
  float fVar235;
  undefined1 auVar236 [16];
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  float fVar241;
  undefined1 in_ZMM12 [64];
  undefined1 auVar239 [64];
  undefined1 auVar240 [64];
  float fVar242;
  float fVar246;
  float fVar247;
  float fVar248;
  float fVar249;
  float fVar250;
  float fVar251;
  undefined1 auVar243 [32];
  undefined1 auVar244 [32];
  undefined1 auVar245 [32];
  undefined1 auVar252 [32];
  undefined1 auVar253 [32];
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  RibbonHit<embree::CatmullRomCurveT<embree::Vec3fx>,_8> bhit;
  undefined1 local_960 [32];
  float local_920;
  float fStack_91c;
  float fStack_918;
  float fStack_914;
  float fStack_910;
  float fStack_90c;
  float fStack_908;
  undefined8 local_840;
  undefined8 uStack_838;
  undefined8 uStack_830;
  undefined8 uStack_828;
  float local_820;
  float fStack_81c;
  float fStack_818;
  float fStack_814;
  RTCFilterFunctionNArguments local_7f0;
  undefined1 local_7c0 [32];
  float local_7a0;
  float fStack_79c;
  float fStack_798;
  float fStack_794;
  float fStack_790;
  float fStack_78c;
  float fStack_788;
  float fStack_784;
  undefined1 local_780 [32];
  undefined1 (*local_748) [32];
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [8];
  float fStack_6f8;
  float fStack_6f4;
  float fStack_6f0;
  float fStack_6ec;
  float fStack_6e8;
  undefined1 local_6e0 [8];
  undefined8 uStack_6d8;
  undefined8 uStack_6d0;
  undefined8 uStack_6c8;
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 uStack_650;
  undefined8 uStack_648;
  LinearSpace3fa *local_628;
  undefined8 local_620;
  undefined8 uStack_618;
  undefined8 uStack_610;
  undefined8 uStack_608;
  undefined1 local_600 [8];
  float fStack_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  float fStack_5e8;
  undefined1 local_5e0 [8];
  float fStack_5d8;
  float fStack_5d4;
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  int local_4c0;
  int local_4bc;
  undefined8 local_4b0;
  undefined8 uStack_4a8;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 local_490;
  undefined8 uStack_488;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined1 local_460 [32];
  float local_440 [4];
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  float fStack_424;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 uStack_410;
  undefined8 uStack_408;
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined4 local_350;
  undefined4 uStack_34c;
  undefined4 uStack_348;
  undefined4 uStack_344;
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined4 local_2e0;
  undefined4 uStack_2dc;
  undefined4 uStack_2d8;
  undefined4 uStack_2d4;
  undefined4 uStack_2d0;
  undefined4 uStack_2cc;
  undefined4 uStack_2c8;
  undefined4 uStack_2c4;
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  uint local_200;
  uint uStack_1fc;
  uint uStack_1f8;
  uint uStack_1f4;
  uint uStack_1f0;
  uint uStack_1ec;
  uint uStack_1e8;
  uint uStack_1e4;
  uint local_1e0;
  uint uStack_1dc;
  uint uStack_1d8;
  uint uStack_1d4;
  uint uStack_1d0;
  uint uStack_1cc;
  uint uStack_1c8;
  uint uStack_1c4;
  uint local_1c0;
  uint uStack_1bc;
  uint uStack_1b8;
  uint uStack_1b4;
  uint uStack_1b0;
  uint uStack_1ac;
  uint uStack_1a8;
  uint uStack_1a4;
  uint local_1a0;
  uint uStack_19c;
  uint uStack_198;
  uint uStack_194;
  uint uStack_190;
  uint uStack_18c;
  uint uStack_188;
  uint uStack_184;
  float local_180;
  float fStack_17c;
  float fStack_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float fStack_168;
  float fStack_164;
  undefined4 local_160;
  undefined4 uStack_15c;
  undefined4 uStack_158;
  undefined4 uStack_154;
  undefined4 uStack_150;
  undefined4 uStack_14c;
  undefined4 uStack_148;
  undefined4 uStack_144;
  float local_140;
  float fStack_13c;
  float fStack_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  float fStack_124;
  undefined1 local_120 [32];
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar189 [32];
  
  PVar16 = prim[1];
  uVar121 = (ulong)(byte)PVar16;
  fVar161 = *(float *)(prim + uVar121 * 0x19 + 0x12);
  auVar20 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar20 = vinsertps_avx(auVar20,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar21 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar21 = vinsertps_avx(auVar21,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar20 = vsubps_avx(auVar20,*(undefined1 (*) [16])(prim + uVar121 * 0x19 + 6));
  auVar125._0_4_ = fVar161 * auVar20._0_4_;
  auVar125._4_4_ = fVar161 * auVar20._4_4_;
  auVar125._8_4_ = fVar161 * auVar20._8_4_;
  auVar125._12_4_ = fVar161 * auVar20._12_4_;
  auVar218._0_4_ = fVar161 * auVar21._0_4_;
  auVar218._4_4_ = fVar161 * auVar21._4_4_;
  auVar218._8_4_ = fVar161 * auVar21._8_4_;
  auVar218._12_4_ = fVar161 * auVar21._12_4_;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar121 * 4 + 6);
  auVar128 = vpmovsxbd_avx2(auVar20);
  auVar128 = vcvtdq2ps_avx(auVar128);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + uVar121 * 5 + 6);
  auVar141 = vpmovsxbd_avx2(auVar21);
  auVar141 = vcvtdq2ps_avx(auVar141);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar121 * 6 + 6);
  auVar137 = vpmovsxbd_avx2(auVar9);
  auVar137 = vcvtdq2ps_avx(auVar137);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar121 * 0xb + 6);
  auVar150 = vpmovsxbd_avx2(auVar10);
  auVar150 = vcvtdq2ps_avx(auVar150);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar16 * 0xc) + 6);
  auVar202 = vpmovsxbd_avx2(auVar11);
  auVar202 = vcvtdq2ps_avx(auVar202);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + (uint)(byte)PVar16 * 0xc + uVar121 + 6);
  auVar177 = vpmovsxbd_avx2(auVar12);
  auVar177 = vcvtdq2ps_avx(auVar177);
  uVar118 = (ulong)(uint)((int)(uVar121 * 9) * 2);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar118 + 6);
  auVar24 = vpmovsxbd_avx2(auVar13);
  auVar24 = vcvtdq2ps_avx(auVar24);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar118 + uVar121 + 6);
  auVar228 = vpmovsxbd_avx2(auVar14);
  auVar228 = vcvtdq2ps_avx(auVar228);
  uVar118 = (ulong)(uint)((int)(uVar121 * 5) << 2);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar118 + 6);
  auVar198 = vpmovsxbd_avx2(auVar15);
  auVar198 = vcvtdq2ps_avx(auVar198);
  auVar243._4_4_ = auVar218._0_4_;
  auVar243._0_4_ = auVar218._0_4_;
  auVar243._8_4_ = auVar218._0_4_;
  auVar243._12_4_ = auVar218._0_4_;
  auVar243._16_4_ = auVar218._0_4_;
  auVar243._20_4_ = auVar218._0_4_;
  auVar243._24_4_ = auVar218._0_4_;
  auVar243._28_4_ = auVar218._0_4_;
  auVar20 = vmovshdup_avx(auVar218);
  uVar217 = auVar20._0_8_;
  auVar252._8_8_ = uVar217;
  auVar252._0_8_ = uVar217;
  auVar252._16_8_ = uVar217;
  auVar252._24_8_ = uVar217;
  auVar20 = vshufps_avx(auVar218,auVar218,0xaa);
  fVar161 = auVar20._0_4_;
  auVar232._0_4_ = fVar161 * auVar137._0_4_;
  fVar160 = auVar20._4_4_;
  auVar232._4_4_ = fVar160 * auVar137._4_4_;
  auVar232._8_4_ = fVar161 * auVar137._8_4_;
  auVar232._12_4_ = fVar160 * auVar137._12_4_;
  auVar232._16_4_ = fVar161 * auVar137._16_4_;
  auVar232._20_4_ = fVar160 * auVar137._20_4_;
  auVar232._28_36_ = in_ZMM12._28_36_;
  auVar232._24_4_ = fVar161 * auVar137._24_4_;
  auVar229._0_4_ = auVar177._0_4_ * fVar161;
  auVar229._4_4_ = auVar177._4_4_ * fVar160;
  auVar229._8_4_ = auVar177._8_4_ * fVar161;
  auVar229._12_4_ = auVar177._12_4_ * fVar160;
  auVar229._16_4_ = auVar177._16_4_ * fVar161;
  auVar229._20_4_ = auVar177._20_4_ * fVar160;
  auVar229._28_36_ = in_ZMM10._28_36_;
  auVar229._24_4_ = auVar177._24_4_ * fVar161;
  auVar225._0_4_ = auVar198._0_4_ * fVar161;
  auVar225._4_4_ = auVar198._4_4_ * fVar160;
  auVar225._8_4_ = auVar198._8_4_ * fVar161;
  auVar225._12_4_ = auVar198._12_4_ * fVar160;
  auVar225._16_4_ = auVar198._16_4_ * fVar161;
  auVar225._20_4_ = auVar198._20_4_ * fVar160;
  auVar225._24_4_ = auVar198._24_4_ * fVar161;
  auVar225._28_4_ = 0;
  auVar20 = vfmadd231ps_fma(auVar232._0_32_,auVar252,auVar141);
  auVar21 = vfmadd231ps_fma(auVar229._0_32_,auVar252,auVar202);
  auVar9 = vfmadd231ps_fma(auVar225,auVar228,auVar252);
  auVar10 = vfmadd231ps_fma(ZEXT1632(auVar20),auVar243,auVar128);
  auVar21 = vfmadd231ps_fma(ZEXT1632(auVar21),auVar243,auVar150);
  auVar232 = ZEXT1664(auVar21);
  auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar24,auVar243);
  auVar213._4_4_ = auVar125._0_4_;
  auVar213._0_4_ = auVar125._0_4_;
  auVar213._8_4_ = auVar125._0_4_;
  auVar213._12_4_ = auVar125._0_4_;
  auVar213._16_4_ = auVar125._0_4_;
  auVar213._20_4_ = auVar125._0_4_;
  auVar213._24_4_ = auVar125._0_4_;
  auVar213._28_4_ = auVar125._0_4_;
  auVar20 = vmovshdup_avx(auVar125);
  uVar217 = auVar20._0_8_;
  auVar253._8_8_ = uVar217;
  auVar253._0_8_ = uVar217;
  auVar253._16_8_ = uVar217;
  auVar253._24_8_ = uVar217;
  auVar20 = vshufps_avx(auVar125,auVar125,0xaa);
  fVar161 = auVar20._0_4_;
  auVar171._0_4_ = fVar161 * auVar137._0_4_;
  fVar160 = auVar20._4_4_;
  auVar171._4_4_ = fVar160 * auVar137._4_4_;
  auVar171._8_4_ = fVar161 * auVar137._8_4_;
  auVar171._12_4_ = fVar160 * auVar137._12_4_;
  auVar171._16_4_ = fVar161 * auVar137._16_4_;
  auVar171._20_4_ = fVar160 * auVar137._20_4_;
  auVar171._24_4_ = fVar161 * auVar137._24_4_;
  auVar171._28_4_ = 0;
  auVar139._4_4_ = auVar177._4_4_ * fVar160;
  auVar139._0_4_ = auVar177._0_4_ * fVar161;
  auVar139._8_4_ = auVar177._8_4_ * fVar161;
  auVar139._12_4_ = auVar177._12_4_ * fVar160;
  auVar139._16_4_ = auVar177._16_4_ * fVar161;
  auVar139._20_4_ = auVar177._20_4_ * fVar160;
  auVar139._24_4_ = auVar177._24_4_ * fVar161;
  auVar139._28_4_ = auVar137._28_4_;
  auVar137._4_4_ = auVar198._4_4_ * fVar160;
  auVar137._0_4_ = auVar198._0_4_ * fVar161;
  auVar137._8_4_ = auVar198._8_4_ * fVar161;
  auVar137._12_4_ = auVar198._12_4_ * fVar160;
  auVar137._16_4_ = auVar198._16_4_ * fVar161;
  auVar137._20_4_ = auVar198._20_4_ * fVar160;
  auVar137._24_4_ = auVar198._24_4_ * fVar161;
  auVar137._28_4_ = fVar160;
  auVar20 = vfmadd231ps_fma(auVar171,auVar253,auVar141);
  auVar11 = vfmadd231ps_fma(auVar139,auVar253,auVar202);
  auVar12 = vfmadd231ps_fma(auVar137,auVar253,auVar228);
  auVar13 = vfmadd231ps_fma(ZEXT1632(auVar20),auVar213,auVar128);
  auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar213,auVar150);
  local_320._8_4_ = 0x7fffffff;
  local_320._0_8_ = 0x7fffffff7fffffff;
  local_320._12_4_ = 0x7fffffff;
  local_320._16_4_ = 0x7fffffff;
  local_320._20_4_ = 0x7fffffff;
  local_320._24_4_ = 0x7fffffff;
  local_320._28_4_ = 0x7fffffff;
  auVar174._8_4_ = 0x219392ef;
  auVar174._0_8_ = 0x219392ef219392ef;
  auVar174._12_4_ = 0x219392ef;
  auVar174._16_4_ = 0x219392ef;
  auVar174._20_4_ = 0x219392ef;
  auVar174._24_4_ = 0x219392ef;
  auVar174._28_4_ = 0x219392ef;
  auVar128 = vandps_avx(ZEXT1632(auVar10),local_320);
  auVar128 = vcmpps_avx(auVar128,auVar174,1);
  auVar141 = vblendvps_avx(ZEXT1632(auVar10),auVar174,auVar128);
  auVar128 = vandps_avx(ZEXT1632(auVar21),local_320);
  auVar128 = vcmpps_avx(auVar128,auVar174,1);
  auVar137 = vblendvps_avx(ZEXT1632(auVar21),auVar174,auVar128);
  auVar128 = vandps_avx(ZEXT1632(auVar9),local_320);
  auVar128 = vcmpps_avx(auVar128,auVar174,1);
  auVar128 = vblendvps_avx(ZEXT1632(auVar9),auVar174,auVar128);
  auVar10 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar213,auVar24);
  auVar150 = vrcpps_avx(auVar141);
  auVar145._8_4_ = 0x3f800000;
  auVar145._0_8_ = &DAT_3f8000003f800000;
  auVar145._12_4_ = 0x3f800000;
  auVar145._16_4_ = 0x3f800000;
  auVar145._20_4_ = 0x3f800000;
  auVar145._24_4_ = 0x3f800000;
  auVar145._28_4_ = 0x3f800000;
  auVar20 = vfnmadd213ps_fma(auVar141,auVar150,auVar145);
  auVar20 = vfmadd132ps_fma(ZEXT1632(auVar20),auVar150,auVar150);
  auVar141 = vrcpps_avx(auVar137);
  auVar21 = vfnmadd213ps_fma(auVar137,auVar141,auVar145);
  auVar21 = vfmadd132ps_fma(ZEXT1632(auVar21),auVar141,auVar141);
  auVar141 = vrcpps_avx(auVar128);
  auVar9 = vfnmadd213ps_fma(auVar128,auVar141,auVar145);
  auVar9 = vfmadd132ps_fma(ZEXT1632(auVar9),auVar141,auVar141);
  auVar128 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar121 * 7 + 6));
  auVar128 = vcvtdq2ps_avx(auVar128);
  auVar128 = vsubps_avx(auVar128,ZEXT1632(auVar13));
  auVar150._4_4_ = auVar20._4_4_ * auVar128._4_4_;
  auVar150._0_4_ = auVar20._0_4_ * auVar128._0_4_;
  auVar150._8_4_ = auVar20._8_4_ * auVar128._8_4_;
  auVar150._12_4_ = auVar20._12_4_ * auVar128._12_4_;
  auVar150._16_4_ = auVar128._16_4_ * 0.0;
  auVar150._20_4_ = auVar128._20_4_ * 0.0;
  auVar150._24_4_ = auVar128._24_4_ * 0.0;
  auVar150._28_4_ = auVar128._28_4_;
  auVar128 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar121 * 9 + 6));
  auVar128 = vcvtdq2ps_avx(auVar128);
  auVar128 = vsubps_avx(auVar128,ZEXT1632(auVar13));
  auVar202._4_4_ = auVar20._4_4_ * auVar128._4_4_;
  auVar202._0_4_ = auVar20._0_4_ * auVar128._0_4_;
  auVar202._8_4_ = auVar20._8_4_ * auVar128._8_4_;
  auVar202._12_4_ = auVar20._12_4_ * auVar128._12_4_;
  auVar202._16_4_ = auVar128._16_4_ * 0.0;
  auVar202._20_4_ = auVar128._20_4_ * 0.0;
  auVar202._24_4_ = auVar128._24_4_ * 0.0;
  auVar202._28_4_ = auVar128._28_4_;
  auVar153._1_3_ = 0;
  auVar153[0] = PVar16;
  auVar141 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar16 * 0x10 + 6));
  auVar128 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                             (prim + (ulong)(byte)PVar16 * 0x10 + uVar121 * -2 + 6));
  auVar128 = vcvtdq2ps_avx(auVar128);
  auVar128 = vsubps_avx(auVar128,ZEXT1632(auVar11));
  auVar177._4_4_ = auVar128._4_4_ * auVar21._4_4_;
  auVar177._0_4_ = auVar128._0_4_ * auVar21._0_4_;
  auVar177._8_4_ = auVar128._8_4_ * auVar21._8_4_;
  auVar177._12_4_ = auVar128._12_4_ * auVar21._12_4_;
  auVar177._16_4_ = auVar128._16_4_ * 0.0;
  auVar177._20_4_ = auVar128._20_4_ * 0.0;
  auVar177._24_4_ = auVar128._24_4_ * 0.0;
  auVar177._28_4_ = auVar128._28_4_;
  auVar128 = vcvtdq2ps_avx(auVar141);
  auVar128 = vsubps_avx(auVar128,ZEXT1632(auVar11));
  auVar24._4_4_ = auVar21._4_4_ * auVar128._4_4_;
  auVar24._0_4_ = auVar21._0_4_ * auVar128._0_4_;
  auVar24._8_4_ = auVar21._8_4_ * auVar128._8_4_;
  auVar24._12_4_ = auVar21._12_4_ * auVar128._12_4_;
  auVar24._16_4_ = auVar128._16_4_ * 0.0;
  auVar24._20_4_ = auVar128._20_4_ * 0.0;
  auVar24._24_4_ = auVar128._24_4_ * 0.0;
  auVar24._28_4_ = auVar128._28_4_;
  auVar128 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar118 + uVar121 + 6));
  auVar128 = vcvtdq2ps_avx(auVar128);
  auVar128 = vsubps_avx(auVar128,ZEXT1632(auVar10));
  auVar228._4_4_ = auVar128._4_4_ * auVar9._4_4_;
  auVar228._0_4_ = auVar128._0_4_ * auVar9._0_4_;
  auVar228._8_4_ = auVar128._8_4_ * auVar9._8_4_;
  auVar228._12_4_ = auVar128._12_4_ * auVar9._12_4_;
  auVar228._16_4_ = auVar128._16_4_ * 0.0;
  auVar228._20_4_ = auVar128._20_4_ * 0.0;
  auVar228._24_4_ = auVar128._24_4_ * 0.0;
  auVar228._28_4_ = auVar128._28_4_;
  auVar128 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar121 * 0x17 + 6));
  auVar128 = vcvtdq2ps_avx(auVar128);
  auVar128 = vsubps_avx(auVar128,ZEXT1632(auVar10));
  auVar198._4_4_ = auVar9._4_4_ * auVar128._4_4_;
  auVar198._0_4_ = auVar9._0_4_ * auVar128._0_4_;
  auVar198._8_4_ = auVar9._8_4_ * auVar128._8_4_;
  auVar198._12_4_ = auVar9._12_4_ * auVar128._12_4_;
  auVar198._16_4_ = auVar128._16_4_ * 0.0;
  auVar198._20_4_ = auVar128._20_4_ * 0.0;
  auVar198._24_4_ = auVar128._24_4_ * 0.0;
  auVar198._28_4_ = auVar128._28_4_;
  auVar128 = vpminsd_avx2(auVar150,auVar202);
  auVar141 = vpminsd_avx2(auVar177,auVar24);
  auVar128 = vmaxps_avx(auVar128,auVar141);
  uVar123 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar176._4_4_ = uVar123;
  auVar176._0_4_ = uVar123;
  auVar176._8_4_ = uVar123;
  auVar176._12_4_ = uVar123;
  auVar176._16_4_ = uVar123;
  auVar176._20_4_ = uVar123;
  auVar176._24_4_ = uVar123;
  auVar176._28_4_ = uVar123;
  auVar141 = vpminsd_avx2(auVar228,auVar198);
  auVar141 = vmaxps_avx(auVar141,auVar176);
  auVar229 = ZEXT3264(CONCAT428(0x3f7ffffa,
                                CONCAT424(0x3f7ffffa,
                                          CONCAT420(0x3f7ffffa,
                                                    CONCAT416(0x3f7ffffa,
                                                              CONCAT412(0x3f7ffffa,
                                                                        CONCAT48(0x3f7ffffa,
                                                                                 0x3f7ffffa3f7ffffa)
                                                                       ))))));
  auVar128 = vmaxps_avx(auVar128,auVar141);
  local_80._4_4_ = auVar128._4_4_ * 0.99999964;
  local_80._0_4_ = auVar128._0_4_ * 0.99999964;
  local_80._8_4_ = auVar128._8_4_ * 0.99999964;
  local_80._12_4_ = auVar128._12_4_ * 0.99999964;
  local_80._16_4_ = auVar128._16_4_ * 0.99999964;
  local_80._20_4_ = auVar128._20_4_ * 0.99999964;
  local_80._24_4_ = auVar128._24_4_ * 0.99999964;
  local_80._28_4_ = auVar141._28_4_;
  auVar128 = vpmaxsd_avx2(auVar150,auVar202);
  auVar141 = vpmaxsd_avx2(auVar177,auVar24);
  auVar128 = vminps_avx(auVar128,auVar141);
  auVar141 = vpmaxsd_avx2(auVar228,auVar198);
  uVar123 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar130._4_4_ = uVar123;
  auVar130._0_4_ = uVar123;
  auVar130._8_4_ = uVar123;
  auVar130._12_4_ = uVar123;
  auVar130._16_4_ = uVar123;
  auVar130._20_4_ = uVar123;
  auVar130._24_4_ = uVar123;
  auVar130._28_4_ = uVar123;
  auVar141 = vminps_avx(auVar141,auVar130);
  auVar128 = vminps_avx(auVar128,auVar141);
  auVar23._4_4_ = auVar128._4_4_ * 1.0000004;
  auVar23._0_4_ = auVar128._0_4_ * 1.0000004;
  auVar23._8_4_ = auVar128._8_4_ * 1.0000004;
  auVar23._12_4_ = auVar128._12_4_ * 1.0000004;
  auVar23._16_4_ = auVar128._16_4_ * 1.0000004;
  auVar23._20_4_ = auVar128._20_4_ * 1.0000004;
  auVar23._24_4_ = auVar128._24_4_ * 1.0000004;
  auVar23._28_4_ = auVar128._28_4_;
  auVar153[4] = PVar16;
  auVar153._5_3_ = 0;
  auVar153[8] = PVar16;
  auVar153._9_3_ = 0;
  auVar153[0xc] = PVar16;
  auVar153._13_3_ = 0;
  auVar153[0x10] = PVar16;
  auVar153._17_3_ = 0;
  auVar153[0x14] = PVar16;
  auVar153._21_3_ = 0;
  auVar153[0x18] = PVar16;
  auVar153._25_3_ = 0;
  auVar153[0x1c] = PVar16;
  auVar153._29_3_ = 0;
  auVar141 = vpcmpgtd_avx2(auVar153,_DAT_0205a920);
  auVar128 = vcmpps_avx(local_80,auVar23,2);
  auVar128 = vandps_avx(auVar128,auVar141);
  uVar115 = vmovmskps_avx(auVar128);
  if (uVar115 != 0) {
    uVar115 = uVar115 & 0xff;
    local_628 = pre->ray_space + k;
    local_620 = mm_lookupmask_ps._16_8_;
    uStack_618 = mm_lookupmask_ps._24_8_;
    uStack_610 = mm_lookupmask_ps._16_8_;
    uStack_608 = mm_lookupmask_ps._24_8_;
    local_748 = (undefined1 (*) [32])&local_200;
    iVar116 = 1 << ((uint)k & 0x1f);
    auVar128._4_4_ = iVar116;
    auVar128._0_4_ = iVar116;
    auVar128._8_4_ = iVar116;
    auVar128._12_4_ = iVar116;
    auVar128._16_4_ = iVar116;
    auVar128._20_4_ = iVar116;
    auVar128._24_4_ = iVar116;
    auVar128._28_4_ = iVar116;
    auVar141 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
    auVar128 = vpand_avx2(auVar128,auVar141);
    local_340 = vpcmpeqd_avx2(auVar128,auVar141);
    local_350 = 0x7fffffff;
    uStack_34c = 0x7fffffff;
    uStack_348 = 0x7fffffff;
    uStack_344 = 0x7fffffff;
    do {
      auVar128 = local_540;
      auVar141 = auVar229._0_32_;
      auVar137 = auVar232._0_32_;
      lVar25 = 0;
      uVar121 = (ulong)uVar115;
      for (uVar118 = uVar121; (uVar118 & 1) == 0; uVar118 = uVar118 >> 1 | 0x8000000000000000) {
        lVar25 = lVar25 + 1;
      }
      uVar115 = *(uint *)(prim + 2);
      uVar17 = *(uint *)(prim + lVar25 * 4 + 6);
      pGVar18 = (context->scene->geometries).items[uVar115].ptr;
      uVar118 = (ulong)*(uint *)(*(long *)&pGVar18->field_0x58 +
                                pGVar18[1].super_RefCount.refCounter.
                                super___atomic_base<unsigned_long>._M_i * (ulong)uVar17);
      p_Var19 = pGVar18[1].intersectionFilterN;
      lVar25 = *(long *)&pGVar18[1].time_range.upper;
      pauVar1 = (undefined1 (*) [16])(lVar25 + (long)p_Var19 * uVar118);
      uVar217 = *(undefined8 *)*pauVar1;
      uVar100 = *(undefined8 *)(*pauVar1 + 8);
      auVar14 = *pauVar1;
      auVar10 = *pauVar1;
      auVar20 = *pauVar1;
      pauVar2 = (undefined1 (*) [16])(lVar25 + (uVar118 + 1) * (long)p_Var19);
      uVar101 = *(undefined8 *)*pauVar2;
      uVar102 = *(undefined8 *)(*pauVar2 + 8);
      auVar11 = *pauVar2;
      auVar9 = *pauVar2;
      pauVar3 = (undefined1 (*) [16])(lVar25 + (uVar118 + 2) * (long)p_Var19);
      uVar103 = *(undefined8 *)*pauVar3;
      uVar104 = *(undefined8 *)(*pauVar3 + 8);
      auVar12 = *pauVar3;
      auVar21 = *pauVar3;
      uVar121 = uVar121 - 1 & uVar121;
      pauVar4 = (undefined1 (*) [16])(lVar25 + (uVar118 + 3) * (long)p_Var19);
      uVar105 = *(undefined8 *)*pauVar4;
      uVar106 = *(undefined8 *)(*pauVar4 + 8);
      auVar13 = *pauVar4;
      local_820 = (float)uVar105;
      fStack_81c = (float)((ulong)uVar105 >> 0x20);
      fStack_818 = (float)uVar106;
      fStack_814 = (float)((ulong)uVar106 >> 0x20);
      if (uVar121 != 0) {
        uVar120 = uVar121 - 1 & uVar121;
        for (uVar118 = uVar121; (uVar118 & 1) == 0; uVar118 = uVar118 >> 1 | 0x8000000000000000) {
        }
        if (uVar120 != 0) {
          for (; (uVar120 & 1) == 0; uVar120 = uVar120 >> 1 | 0x8000000000000000) {
          }
        }
      }
      iVar116 = (int)pGVar18[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar15 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20))
                              ,0x1c);
      auVar22 = vinsertps_avx(auVar15,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
      auVar125 = vsubps_avx(*pauVar1,auVar22);
      uVar123 = auVar125._0_4_;
      auVar190._4_4_ = uVar123;
      auVar190._0_4_ = uVar123;
      auVar190._8_4_ = uVar123;
      auVar190._12_4_ = uVar123;
      auVar15 = vshufps_avx(auVar125,auVar125,0x55);
      auVar125 = vshufps_avx(auVar125,auVar125,0xaa);
      aVar7 = (local_628->vx).field_0;
      aVar8 = (local_628->vy).field_0;
      fVar161 = (local_628->vz).field_0.m128[0];
      fVar160 = *(float *)((long)&(local_628->vz).field_0 + 4);
      fVar203 = *(float *)((long)&(local_628->vz).field_0 + 8);
      fVar204 = *(float *)((long)&(local_628->vz).field_0 + 0xc);
      auVar209._0_4_ = fVar161 * auVar125._0_4_;
      auVar209._4_4_ = fVar160 * auVar125._4_4_;
      auVar209._8_4_ = fVar203 * auVar125._8_4_;
      auVar209._12_4_ = fVar204 * auVar125._12_4_;
      auVar15 = vfmadd231ps_fma(auVar209,(undefined1  [16])aVar8,auVar15);
      auVar209 = vfmadd231ps_fma(auVar15,(undefined1  [16])aVar7,auVar190);
      auVar15 = vblendps_avx(auVar209,*pauVar1,8);
      auVar218 = vsubps_avx(*pauVar2,auVar22);
      uVar123 = auVar218._0_4_;
      auVar210._4_4_ = uVar123;
      auVar210._0_4_ = uVar123;
      auVar210._8_4_ = uVar123;
      auVar210._12_4_ = uVar123;
      auVar125 = vshufps_avx(auVar218,auVar218,0x55);
      auVar218 = vshufps_avx(auVar218,auVar218,0xaa);
      auVar230._0_4_ = fVar161 * auVar218._0_4_;
      auVar230._4_4_ = fVar160 * auVar218._4_4_;
      auVar230._8_4_ = fVar203 * auVar218._8_4_;
      auVar230._12_4_ = fVar204 * auVar218._12_4_;
      auVar125 = vfmadd231ps_fma(auVar230,(undefined1  [16])aVar8,auVar125);
      auVar210 = vfmadd231ps_fma(auVar125,(undefined1  [16])aVar7,auVar210);
      auVar125 = vblendps_avx(auVar210,*pauVar2,8);
      auVar190 = vsubps_avx(*pauVar3,auVar22);
      uVar123 = auVar190._0_4_;
      auVar219._4_4_ = uVar123;
      auVar219._0_4_ = uVar123;
      auVar219._8_4_ = uVar123;
      auVar219._12_4_ = uVar123;
      auVar218 = vshufps_avx(auVar190,auVar190,0x55);
      auVar190 = vshufps_avx(auVar190,auVar190,0xaa);
      auVar234._0_4_ = fVar161 * auVar190._0_4_;
      auVar234._4_4_ = fVar160 * auVar190._4_4_;
      auVar234._8_4_ = fVar203 * auVar190._8_4_;
      auVar234._12_4_ = fVar204 * auVar190._12_4_;
      auVar218 = vfmadd231ps_fma(auVar234,(undefined1  [16])aVar8,auVar218);
      auVar219 = vfmadd231ps_fma(auVar218,(undefined1  [16])aVar7,auVar219);
      auVar218 = vblendps_avx(auVar219,*pauVar3,8);
      auVar26._12_4_ = fStack_814;
      auVar26._0_12_ = *(undefined1 (*) [12])*pauVar4;
      auVar190 = vsubps_avx(auVar26,auVar22);
      uVar123 = auVar190._0_4_;
      auVar220._4_4_ = uVar123;
      auVar220._0_4_ = uVar123;
      auVar220._8_4_ = uVar123;
      auVar220._12_4_ = uVar123;
      auVar22 = vshufps_avx(auVar190,auVar190,0x55);
      auVar190 = vshufps_avx(auVar190,auVar190,0xaa);
      auVar236._0_4_ = fVar161 * auVar190._0_4_;
      auVar236._4_4_ = fVar160 * auVar190._4_4_;
      auVar236._8_4_ = fVar203 * auVar190._8_4_;
      auVar236._12_4_ = fVar204 * auVar190._12_4_;
      auVar22 = vfmadd231ps_fma(auVar236,(undefined1  [16])aVar8,auVar22);
      auVar220 = vfmadd231ps_fma(auVar22,(undefined1  [16])aVar7,auVar220);
      auVar22 = vblendps_avx(auVar220,auVar26,8);
      auVar27._4_4_ = uStack_34c;
      auVar27._0_4_ = local_350;
      auVar27._8_4_ = uStack_348;
      auVar27._12_4_ = uStack_344;
      auVar15 = vandps_avx(auVar15,auVar27);
      auVar125 = vandps_avx(auVar125,auVar27);
      auVar190 = vmaxps_avx(auVar15,auVar125);
      auVar15 = vandps_avx(auVar218,auVar27);
      auVar125 = vandps_avx(auVar22,auVar27);
      auVar15 = vmaxps_avx(auVar15,auVar125);
      auVar15 = vmaxps_avx(auVar190,auVar15);
      auVar125 = vmovshdup_avx(auVar15);
      auVar125 = vmaxss_avx(auVar125,auVar15);
      auVar15 = vshufpd_avx(auVar15,auVar15,1);
      auVar15 = vmaxss_avx(auVar15,auVar125);
      lVar25 = (long)iVar116 * 0x44;
      auVar125 = vmovshdup_avx(auVar209);
      uVar124 = auVar125._0_8_;
      local_6a0._8_8_ = uVar124;
      local_6a0._0_8_ = uVar124;
      local_6a0._16_8_ = uVar124;
      local_6a0._24_8_ = uVar124;
      auVar150 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar25 + 0x484);
      auVar125 = vmovshdup_avx(auVar210);
      uVar124 = auVar125._0_8_;
      local_720._8_8_ = uVar124;
      local_720._0_8_ = uVar124;
      local_720._16_8_ = uVar124;
      local_720._24_8_ = uVar124;
      auVar202 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar25 + 0x908);
      uVar233 = auVar219._0_4_;
      auVar170._4_4_ = uVar233;
      auVar170._0_4_ = uVar233;
      auVar170._8_4_ = uVar233;
      auVar170._12_4_ = uVar233;
      auVar170._16_4_ = uVar233;
      auVar170._20_4_ = uVar233;
      auVar170._24_4_ = uVar233;
      auVar170._28_4_ = uVar233;
      auVar125 = vmovshdup_avx(auVar219);
      uVar124 = auVar125._0_8_;
      auVar196._8_8_ = uVar124;
      auVar196._0_8_ = uVar124;
      auVar196._16_8_ = uVar124;
      auVar196._24_8_ = uVar124;
      fVar160 = *(float *)*(undefined1 (*) [28])(catmullrom_basis0 + lVar25 + 0xd8c);
      fVar203 = *(float *)(catmullrom_basis0 + lVar25 + 0xd90);
      fVar204 = *(float *)(catmullrom_basis0 + lVar25 + 0xd94);
      fVar205 = *(float *)(catmullrom_basis0 + lVar25 + 0xd98);
      fVar206 = *(float *)(catmullrom_basis0 + lVar25 + 0xd9c);
      fVar207 = *(float *)(catmullrom_basis0 + lVar25 + 0xda0);
      fVar208 = *(float *)(catmullrom_basis0 + lVar25 + 0xda4);
      auVar113 = *(undefined1 (*) [28])(catmullrom_basis0 + lVar25 + 0xd8c);
      local_7a0 = auVar220._0_4_;
      auVar125 = vmovshdup_avx(auVar220);
      auVar211._0_4_ = fVar160 * local_7a0;
      auVar211._4_4_ = fVar203 * local_7a0;
      auVar211._8_4_ = fVar204 * local_7a0;
      auVar211._12_4_ = fVar205 * local_7a0;
      auVar211._16_4_ = fVar206 * local_7a0;
      auVar211._20_4_ = fVar207 * local_7a0;
      auVar211._24_4_ = fVar208 * local_7a0;
      auVar211._28_4_ = 0;
      fVar242 = auVar125._0_4_;
      auVar129._0_4_ = fVar242 * fVar160;
      fVar246 = auVar125._4_4_;
      auVar129._4_4_ = fVar246 * fVar203;
      auVar129._8_4_ = fVar242 * fVar204;
      auVar129._12_4_ = fVar246 * fVar205;
      auVar129._16_4_ = fVar242 * fVar206;
      auVar129._20_4_ = fVar246 * fVar207;
      auVar129._24_4_ = fVar242 * fVar208;
      auVar129._28_4_ = 0;
      auVar125 = vfmadd231ps_fma(auVar211,auVar202,auVar170);
      auVar218 = vfmadd231ps_fma(auVar129,auVar202,auVar196);
      uVar123 = auVar210._0_4_;
      local_7c0._4_4_ = uVar123;
      local_7c0._0_4_ = uVar123;
      local_7c0._8_4_ = uVar123;
      local_7c0._12_4_ = uVar123;
      local_7c0._16_4_ = uVar123;
      local_7c0._20_4_ = uVar123;
      local_7c0._24_4_ = uVar123;
      local_7c0._28_4_ = uVar123;
      auVar125 = vfmadd231ps_fma(ZEXT1632(auVar125),auVar150,local_7c0);
      auVar218 = vfmadd231ps_fma(ZEXT1632(auVar218),auVar150,local_720);
      auVar177 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar25);
      uVar123 = auVar209._0_4_;
      local_780._4_4_ = uVar123;
      local_780._0_4_ = uVar123;
      local_780._8_4_ = uVar123;
      local_780._12_4_ = uVar123;
      local_780._16_4_ = uVar123;
      local_780._20_4_ = uVar123;
      local_780._24_4_ = uVar123;
      local_780._28_4_ = uVar123;
      auVar125 = vfmadd231ps_fma(ZEXT1632(auVar125),auVar177,local_780);
      auVar218 = vfmadd231ps_fma(ZEXT1632(auVar218),auVar177,local_6a0);
      auVar24 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar25 + 0x908);
      fVar93 = *(float *)(catmullrom_basis1 + lVar25 + 0xd8c);
      fVar94 = *(float *)(catmullrom_basis1 + lVar25 + 0xd90);
      fVar95 = *(float *)(catmullrom_basis1 + lVar25 + 0xd94);
      fVar96 = *(float *)(catmullrom_basis1 + lVar25 + 0xd98);
      fVar97 = *(float *)(catmullrom_basis1 + lVar25 + 0xd9c);
      fVar98 = *(float *)(catmullrom_basis1 + lVar25 + 0xda0);
      fVar99 = *(float *)(catmullrom_basis1 + lVar25 + 0xda4);
      auVar28._4_4_ = fVar94 * local_7a0;
      auVar28._0_4_ = fVar93 * local_7a0;
      auVar28._8_4_ = fVar95 * local_7a0;
      auVar28._12_4_ = fVar96 * local_7a0;
      auVar28._16_4_ = fVar97 * local_7a0;
      auVar28._20_4_ = fVar98 * local_7a0;
      auVar28._24_4_ = fVar99 * local_7a0;
      auVar28._28_4_ = local_7a0;
      auVar22 = vfmadd231ps_fma(auVar28,auVar24,auVar170);
      auVar29._4_4_ = fVar246 * fVar94;
      auVar29._0_4_ = fVar242 * fVar93;
      auVar29._8_4_ = fVar242 * fVar95;
      auVar29._12_4_ = fVar246 * fVar96;
      auVar29._16_4_ = fVar242 * fVar97;
      auVar29._20_4_ = fVar246 * fVar98;
      auVar29._24_4_ = fVar242 * fVar99;
      auVar29._28_4_ = uVar233;
      auVar190 = vfmadd231ps_fma(auVar29,auVar24,auVar196);
      auVar228 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar25 + 0x484);
      auVar22 = vfmadd231ps_fma(ZEXT1632(auVar22),auVar228,local_7c0);
      auVar190 = vfmadd231ps_fma(ZEXT1632(auVar190),auVar228,local_720);
      auVar198 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar25);
      auVar22 = vfmadd231ps_fma(ZEXT1632(auVar22),auVar198,local_780);
      auVar190 = vfmadd231ps_fma(ZEXT1632(auVar190),auVar198,local_6a0);
      auVar145 = ZEXT1632(auVar22);
      local_380 = ZEXT1632(auVar125);
      auVar23 = vsubps_avx(auVar145,local_380);
      auVar171 = ZEXT1632(auVar190);
      auVar130 = ZEXT1632(auVar218);
      auVar153 = vsubps_avx(auVar171,auVar130);
      auVar131._0_4_ = auVar218._0_4_ * auVar23._0_4_;
      auVar131._4_4_ = auVar218._4_4_ * auVar23._4_4_;
      auVar131._8_4_ = auVar218._8_4_ * auVar23._8_4_;
      auVar131._12_4_ = auVar218._12_4_ * auVar23._12_4_;
      auVar131._16_4_ = auVar23._16_4_ * 0.0;
      auVar131._20_4_ = auVar23._20_4_ * 0.0;
      auVar131._24_4_ = auVar23._24_4_ * 0.0;
      auVar131._28_4_ = 0;
      fVar235 = auVar153._0_4_;
      auVar146._0_4_ = fVar235 * auVar125._0_4_;
      fVar241 = auVar153._4_4_;
      auVar146._4_4_ = fVar241 * auVar125._4_4_;
      fVar247 = auVar153._8_4_;
      auVar146._8_4_ = fVar247 * auVar125._8_4_;
      fVar248 = auVar153._12_4_;
      auVar146._12_4_ = fVar248 * auVar125._12_4_;
      fVar249 = auVar153._16_4_;
      auVar146._16_4_ = fVar249 * 0.0;
      fVar250 = auVar153._20_4_;
      auVar146._20_4_ = fVar250 * 0.0;
      fVar251 = auVar153._24_4_;
      auVar146._24_4_ = fVar251 * 0.0;
      auVar146._28_4_ = 0;
      auVar174 = vsubps_avx(auVar131,auVar146);
      auVar125 = vpermilps_avx(*pauVar1,0xff);
      uVar124 = auVar125._0_8_;
      local_a0._8_8_ = uVar124;
      local_a0._0_8_ = uVar124;
      local_a0._16_8_ = uVar124;
      local_a0._24_8_ = uVar124;
      auVar218 = vpermilps_avx(*pauVar2,0xff);
      uVar124 = auVar218._0_8_;
      local_c0._8_8_ = uVar124;
      local_c0._0_8_ = uVar124;
      local_c0._16_8_ = uVar124;
      local_c0._24_8_ = uVar124;
      auVar218 = vpermilps_avx(*pauVar3,0xff);
      uVar124 = auVar218._0_8_;
      local_e0._8_8_ = uVar124;
      local_e0._0_8_ = uVar124;
      local_e0._16_8_ = uVar124;
      local_e0._24_8_ = uVar124;
      auVar22._12_4_ = fStack_814;
      auVar22._0_12_ = *(undefined1 (*) [12])*pauVar4;
      auVar218 = vpermilps_avx(auVar22,0xff);
      local_100 = auVar218._0_8_;
      fVar161 = auVar218._0_4_;
      auVar212._0_4_ = fVar160 * fVar161;
      fVar160 = auVar218._4_4_;
      auVar212._4_4_ = fVar203 * fVar160;
      auVar212._8_4_ = fVar204 * fVar161;
      auVar212._12_4_ = fVar205 * fVar160;
      auVar212._16_4_ = fVar206 * fVar161;
      auVar212._20_4_ = fVar207 * fVar160;
      auVar212._24_4_ = fVar208 * fVar161;
      auVar212._28_4_ = 0;
      auVar218 = vfmadd231ps_fma(auVar212,local_e0,auVar202);
      auVar218 = vfmadd231ps_fma(ZEXT1632(auVar218),local_c0,auVar150);
      auVar22 = vfmadd231ps_fma(ZEXT1632(auVar218),auVar177,local_a0);
      uStack_f8 = local_100;
      uStack_f0 = local_100;
      uStack_e8 = local_100;
      auVar30._4_4_ = fVar94 * fVar160;
      auVar30._0_4_ = fVar93 * fVar161;
      auVar30._8_4_ = fVar95 * fVar161;
      auVar30._12_4_ = fVar96 * fVar160;
      auVar30._16_4_ = fVar97 * fVar161;
      auVar30._20_4_ = fVar98 * fVar160;
      auVar30._24_4_ = fVar99 * fVar161;
      auVar30._28_4_ = auVar177._28_4_;
      auVar218 = vfmadd231ps_fma(auVar30,auVar24,local_e0);
      auVar218 = vfmadd231ps_fma(ZEXT1632(auVar218),auVar228,local_c0);
      auVar190 = vfmadd231ps_fma(ZEXT1632(auVar218),auVar198,local_a0);
      auVar31._4_4_ = fVar241 * fVar241;
      auVar31._0_4_ = fVar235 * fVar235;
      auVar31._8_4_ = fVar247 * fVar247;
      auVar31._12_4_ = fVar248 * fVar248;
      auVar31._16_4_ = fVar249 * fVar249;
      auVar31._20_4_ = fVar250 * fVar250;
      auVar31._24_4_ = fVar251 * fVar251;
      auVar31._28_4_ = auVar125._4_4_;
      auVar125 = vfmadd231ps_fma(auVar31,auVar23,auVar23);
      auVar139 = vmaxps_avx(ZEXT1632(auVar22),ZEXT1632(auVar190));
      auVar32._4_4_ = auVar139._4_4_ * auVar139._4_4_ * auVar125._4_4_;
      auVar32._0_4_ = auVar139._0_4_ * auVar139._0_4_ * auVar125._0_4_;
      auVar32._8_4_ = auVar139._8_4_ * auVar139._8_4_ * auVar125._8_4_;
      auVar32._12_4_ = auVar139._12_4_ * auVar139._12_4_ * auVar125._12_4_;
      auVar32._16_4_ = auVar139._16_4_ * auVar139._16_4_ * 0.0;
      auVar32._20_4_ = auVar139._20_4_ * auVar139._20_4_ * 0.0;
      auVar32._24_4_ = auVar139._24_4_ * auVar139._24_4_ * 0.0;
      auVar32._28_4_ = auVar139._28_4_;
      auVar33._4_4_ = auVar174._4_4_ * auVar174._4_4_;
      auVar33._0_4_ = auVar174._0_4_ * auVar174._0_4_;
      auVar33._8_4_ = auVar174._8_4_ * auVar174._8_4_;
      auVar33._12_4_ = auVar174._12_4_ * auVar174._12_4_;
      auVar33._16_4_ = auVar174._16_4_ * auVar174._16_4_;
      auVar33._20_4_ = auVar174._20_4_ * auVar174._20_4_;
      auVar33._24_4_ = auVar174._24_4_ * auVar174._24_4_;
      auVar33._28_4_ = auVar174._28_4_;
      auVar139 = vcmpps_avx(auVar33,auVar32,2);
      auVar181 = ZEXT3264(auVar139);
      fVar161 = auVar15._0_4_ * 4.7683716e-07;
      auVar132._0_4_ = (float)iVar116;
      local_540._4_12_ = auVar219._4_12_;
      local_540._0_4_ = auVar132._0_4_;
      local_540._16_16_ = auVar128._16_16_;
      auVar132._4_4_ = auVar132._0_4_;
      auVar132._8_4_ = auVar132._0_4_;
      auVar132._12_4_ = auVar132._0_4_;
      auVar132._16_4_ = auVar132._0_4_;
      auVar132._20_4_ = auVar132._0_4_;
      auVar132._24_4_ = auVar132._0_4_;
      auVar132._28_4_ = auVar132._0_4_;
      auVar128 = vcmpps_avx(_DAT_02020f40,auVar132,1);
      auVar125 = vpermilps_avx(auVar209,0xaa);
      uVar124 = auVar125._0_8_;
      local_5a0._8_8_ = uVar124;
      local_5a0._0_8_ = uVar124;
      local_5a0._16_8_ = uVar124;
      local_5a0._24_8_ = uVar124;
      auVar218 = vpermilps_avx(auVar210,0xaa);
      uVar124 = auVar218._0_8_;
      local_580._8_8_ = uVar124;
      local_580._0_8_ = uVar124;
      local_580._16_8_ = uVar124;
      local_580._24_8_ = uVar124;
      auVar15 = vshufps_avx(auVar219,auVar219,0xaa);
      uVar124 = auVar15._0_8_;
      local_300._8_8_ = uVar124;
      local_300._0_8_ = uVar124;
      local_300._16_8_ = uVar124;
      local_300._24_8_ = uVar124;
      auVar15 = vshufps_avx(auVar220,auVar220,0xaa);
      uVar124 = auVar15._0_8_;
      register0x00001508 = uVar124;
      local_700 = uVar124;
      register0x00001510 = uVar124;
      register0x00001518 = uVar124;
      auVar239 = ZEXT3264(_local_700);
      auVar174 = auVar128 & auVar139;
      uVar119 = *(uint *)(ray + k * 4 + 0x60);
      local_740._0_16_ = ZEXT416(uVar119);
      fStack_79c = local_7a0;
      fStack_798 = local_7a0;
      fStack_794 = local_7a0;
      fStack_790 = local_7a0;
      fStack_78c = local_7a0;
      fStack_788 = local_7a0;
      fStack_784 = local_7a0;
      if ((((((((auVar174 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar174 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar174 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar174 >> 0x7f,0) == '\0') &&
            (auVar174 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar174 >> 0xbf,0) == '\0') &&
          (auVar174 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar174[0x1f]) {
        auVar232 = ZEXT3264(auVar137);
        auVar229 = ZEXT3264(auVar141);
        auVar159 = ZEXT3264(local_720);
        auVar221 = ZEXT3264(CONCAT428(local_7a0,
                                      CONCAT424(local_7a0,
                                                CONCAT420(local_7a0,
                                                          CONCAT416(local_7a0,
                                                                    CONCAT412(local_7a0,
                                                                              CONCAT48(local_7a0,
                                                                                       CONCAT44(
                                                  local_7a0,local_7a0))))))));
        auVar224 = ZEXT3264(local_7c0);
        auVar216 = ZEXT3264(local_780);
      }
      else {
        local_3a0 = vandps_avx(auVar139,auVar128);
        fVar235 = auVar15._0_4_;
        fVar241 = auVar15._4_4_;
        auVar34._4_4_ = fVar241 * fVar94;
        auVar34._0_4_ = fVar235 * fVar93;
        auVar34._8_4_ = fVar235 * fVar95;
        auVar34._12_4_ = fVar241 * fVar96;
        auVar34._16_4_ = fVar235 * fVar97;
        auVar34._20_4_ = fVar241 * fVar98;
        auVar34._24_4_ = fVar235 * fVar99;
        auVar34._28_4_ = local_3a0._28_4_;
        auVar15 = vfmadd213ps_fma(auVar24,local_300,auVar34);
        auVar15 = vfmadd213ps_fma(auVar228,local_580,ZEXT1632(auVar15));
        auVar15 = vfmadd213ps_fma(auVar198,local_5a0,ZEXT1632(auVar15));
        local_600._0_4_ = auVar113._0_4_;
        local_600._4_4_ = auVar113._4_4_;
        fStack_5f8 = auVar113._8_4_;
        fStack_5f4 = auVar113._12_4_;
        fStack_5f0 = auVar113._16_4_;
        fStack_5ec = auVar113._20_4_;
        fStack_5e8 = auVar113._24_4_;
        auVar133._0_4_ = fVar235 * (float)local_600._0_4_;
        auVar133._4_4_ = fVar241 * (float)local_600._4_4_;
        auVar133._8_4_ = fVar235 * fStack_5f8;
        auVar133._12_4_ = fVar241 * fStack_5f4;
        auVar133._16_4_ = fVar235 * fStack_5f0;
        auVar133._20_4_ = fVar241 * fStack_5ec;
        auVar133._24_4_ = fVar235 * fStack_5e8;
        auVar133._28_4_ = 0;
        auVar209 = vfmadd213ps_fma(auVar202,local_300,auVar133);
        auVar209 = vfmadd213ps_fma(auVar150,local_580,ZEXT1632(auVar209));
        auVar128 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar25 + 0x1210);
        auVar150 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar25 + 0x1694);
        auVar202 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar25 + 0x1b18);
        fVar160 = *(float *)(catmullrom_basis0 + lVar25 + 0x1f9c);
        fVar203 = *(float *)(catmullrom_basis0 + lVar25 + 0x1fa0);
        fVar204 = *(float *)(catmullrom_basis0 + lVar25 + 0x1fa4);
        fVar205 = *(float *)(catmullrom_basis0 + lVar25 + 0x1fa8);
        fVar206 = *(float *)(catmullrom_basis0 + lVar25 + 0x1fac);
        fVar207 = *(float *)(catmullrom_basis0 + lVar25 + 0x1fb0);
        fVar208 = *(float *)(catmullrom_basis0 + lVar25 + 0x1fb4);
        auVar197._0_4_ = local_7a0 * fVar160;
        auVar197._4_4_ = local_7a0 * fVar203;
        auVar197._8_4_ = local_7a0 * fVar204;
        auVar197._12_4_ = local_7a0 * fVar205;
        auVar197._16_4_ = local_7a0 * fVar206;
        auVar197._20_4_ = local_7a0 * fVar207;
        auVar197._24_4_ = local_7a0 * fVar208;
        auVar197._28_4_ = 0;
        auVar35._4_4_ = fVar246 * fVar203;
        auVar35._0_4_ = fVar242 * fVar160;
        auVar35._8_4_ = fVar242 * fVar204;
        auVar35._12_4_ = fVar246 * fVar205;
        auVar35._16_4_ = fVar242 * fVar206;
        auVar35._20_4_ = fVar246 * fVar207;
        auVar35._24_4_ = fVar242 * fVar208;
        auVar35._28_4_ = auVar218._4_4_;
        auVar36._4_4_ = fVar241 * fVar203;
        auVar36._0_4_ = fVar235 * fVar160;
        auVar36._8_4_ = fVar235 * fVar204;
        auVar36._12_4_ = fVar241 * fVar205;
        auVar36._16_4_ = fVar235 * fVar206;
        auVar36._20_4_ = fVar241 * fVar207;
        auVar36._24_4_ = fVar235 * fVar208;
        auVar36._28_4_ = fVar241;
        auVar218 = vfmadd231ps_fma(auVar197,auVar202,auVar170);
        auVar210 = vfmadd231ps_fma(auVar35,auVar202,auVar196);
        auVar219 = vfmadd231ps_fma(auVar36,local_300,auVar202);
        auVar218 = vfmadd231ps_fma(ZEXT1632(auVar218),auVar150,local_7c0);
        auVar210 = vfmadd231ps_fma(ZEXT1632(auVar210),auVar150,local_720);
        auVar219 = vfmadd231ps_fma(ZEXT1632(auVar219),auVar150,local_580);
        auVar218 = vfmadd231ps_fma(ZEXT1632(auVar218),auVar128,local_780);
        auVar210 = vfmadd231ps_fma(ZEXT1632(auVar210),auVar128,local_6a0);
        auVar219 = vfmadd231ps_fma(ZEXT1632(auVar219),local_5a0,auVar128);
        fVar160 = *(float *)(catmullrom_basis1 + lVar25 + 0x1f9c);
        fVar203 = *(float *)(catmullrom_basis1 + lVar25 + 0x1fa0);
        fVar204 = *(float *)(catmullrom_basis1 + lVar25 + 0x1fa4);
        fVar205 = *(float *)(catmullrom_basis1 + lVar25 + 0x1fa8);
        fVar206 = *(float *)(catmullrom_basis1 + lVar25 + 0x1fac);
        fVar207 = *(float *)(catmullrom_basis1 + lVar25 + 0x1fb0);
        fVar208 = *(float *)(catmullrom_basis1 + lVar25 + 0x1fb4);
        auVar37._4_4_ = local_7a0 * fVar203;
        auVar37._0_4_ = local_7a0 * fVar160;
        auVar37._8_4_ = local_7a0 * fVar204;
        auVar37._12_4_ = local_7a0 * fVar205;
        auVar37._16_4_ = local_7a0 * fVar206;
        auVar37._20_4_ = local_7a0 * fVar207;
        auVar37._24_4_ = local_7a0 * fVar208;
        auVar37._28_4_ = auVar128._28_4_;
        auVar38._4_4_ = fVar246 * fVar203;
        auVar38._0_4_ = fVar242 * fVar160;
        auVar38._8_4_ = fVar242 * fVar204;
        auVar38._12_4_ = fVar246 * fVar205;
        auVar38._16_4_ = fVar242 * fVar206;
        auVar38._20_4_ = fVar246 * fVar207;
        auVar38._24_4_ = fVar242 * fVar208;
        auVar38._28_4_ = fVar246;
        auVar39._4_4_ = fVar203 * fVar241;
        auVar39._0_4_ = fVar160 * fVar235;
        auVar39._8_4_ = fVar204 * fVar235;
        auVar39._12_4_ = fVar205 * fVar241;
        auVar39._16_4_ = fVar206 * fVar235;
        auVar39._20_4_ = fVar207 * fVar241;
        auVar39._24_4_ = fVar208 * fVar235;
        auVar39._28_4_ = auVar125._4_4_;
        auVar128 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar25 + 0x1b18);
        auVar125 = vfmadd231ps_fma(auVar37,auVar128,auVar170);
        auVar220 = vfmadd231ps_fma(auVar38,auVar128,auVar196);
        auVar26 = vfmadd231ps_fma(auVar39,auVar128,local_300);
        auVar128 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar25 + 0x1694);
        auVar125 = vfmadd231ps_fma(ZEXT1632(auVar125),auVar128,local_7c0);
        auVar220 = vfmadd231ps_fma(ZEXT1632(auVar220),auVar128,local_720);
        auVar26 = vfmadd231ps_fma(ZEXT1632(auVar26),local_580,auVar128);
        auVar128 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar25 + 0x1210);
        auVar125 = vfmadd231ps_fma(ZEXT1632(auVar125),auVar128,local_780);
        auVar220 = vfmadd231ps_fma(ZEXT1632(auVar220),auVar128,local_6a0);
        auVar26 = vfmadd231ps_fma(ZEXT1632(auVar26),local_5a0,auVar128);
        auVar128 = vandps_avx(local_320,ZEXT1632(auVar218));
        auVar150 = vandps_avx(ZEXT1632(auVar210),local_320);
        auVar150 = vmaxps_avx(auVar128,auVar150);
        auVar128 = vandps_avx(ZEXT1632(auVar219),local_320);
        auVar128 = vmaxps_avx(auVar150,auVar128);
        auVar147._4_4_ = fVar161;
        auVar147._0_4_ = fVar161;
        auVar147._8_4_ = fVar161;
        auVar147._12_4_ = fVar161;
        auVar147._16_4_ = fVar161;
        auVar147._20_4_ = fVar161;
        auVar147._24_4_ = fVar161;
        auVar147._28_4_ = fVar161;
        auVar128 = vcmpps_avx(auVar128,auVar147,1);
        auVar202 = vblendvps_avx(ZEXT1632(auVar218),auVar23,auVar128);
        auVar24 = vblendvps_avx(ZEXT1632(auVar210),auVar153,auVar128);
        auVar128 = vandps_avx(ZEXT1632(auVar125),local_320);
        auVar150 = vandps_avx(ZEXT1632(auVar220),local_320);
        auVar150 = vmaxps_avx(auVar128,auVar150);
        auVar128 = vandps_avx(ZEXT1632(auVar26),local_320);
        auVar128 = vmaxps_avx(auVar150,auVar128);
        auVar150 = vcmpps_avx(auVar128,auVar147,1);
        auVar128 = vblendvps_avx(ZEXT1632(auVar125),auVar23,auVar150);
        auVar150 = vblendvps_avx(ZEXT1632(auVar220),auVar153,auVar150);
        auVar125 = vfmadd213ps_fma(auVar177,local_5a0,ZEXT1632(auVar209));
        auVar218 = vfmadd213ps_fma(auVar202,auVar202,ZEXT832(0) << 0x20);
        auVar218 = vfmadd231ps_fma(ZEXT1632(auVar218),auVar24,auVar24);
        auVar177 = vrsqrtps_avx(ZEXT1632(auVar218));
        fVar160 = auVar177._0_4_;
        fVar203 = auVar177._4_4_;
        fVar204 = auVar177._8_4_;
        fVar205 = auVar177._12_4_;
        fVar206 = auVar177._16_4_;
        fVar207 = auVar177._20_4_;
        fVar208 = auVar177._24_4_;
        auVar40._4_4_ = fVar203 * fVar203 * fVar203 * auVar218._4_4_ * -0.5;
        auVar40._0_4_ = fVar160 * fVar160 * fVar160 * auVar218._0_4_ * -0.5;
        auVar40._8_4_ = fVar204 * fVar204 * fVar204 * auVar218._8_4_ * -0.5;
        auVar40._12_4_ = fVar205 * fVar205 * fVar205 * auVar218._12_4_ * -0.5;
        auVar40._16_4_ = fVar206 * fVar206 * fVar206 * -0.0;
        auVar40._20_4_ = fVar207 * fVar207 * fVar207 * -0.0;
        auVar40._24_4_ = fVar208 * fVar208 * fVar208 * -0.0;
        auVar40._28_4_ = 0;
        auVar244._8_4_ = 0x3fc00000;
        auVar244._0_8_ = 0x3fc000003fc00000;
        auVar244._12_4_ = 0x3fc00000;
        auVar244._16_4_ = 0x3fc00000;
        auVar244._20_4_ = 0x3fc00000;
        auVar244._24_4_ = 0x3fc00000;
        auVar244._28_4_ = 0x3fc00000;
        auVar218 = vfmadd231ps_fma(auVar40,auVar244,auVar177);
        fVar160 = auVar218._0_4_;
        fVar203 = auVar218._4_4_;
        auVar41._4_4_ = auVar24._4_4_ * fVar203;
        auVar41._0_4_ = auVar24._0_4_ * fVar160;
        fVar204 = auVar218._8_4_;
        auVar41._8_4_ = auVar24._8_4_ * fVar204;
        fVar205 = auVar218._12_4_;
        auVar41._12_4_ = auVar24._12_4_ * fVar205;
        auVar41._16_4_ = auVar24._16_4_ * 0.0;
        auVar41._20_4_ = auVar24._20_4_ * 0.0;
        auVar41._24_4_ = auVar24._24_4_ * 0.0;
        auVar41._28_4_ = auVar177._28_4_;
        auVar42._4_4_ = -auVar202._4_4_ * fVar203;
        auVar42._0_4_ = -auVar202._0_4_ * fVar160;
        auVar42._8_4_ = -auVar202._8_4_ * fVar204;
        auVar42._12_4_ = -auVar202._12_4_ * fVar205;
        auVar42._16_4_ = -auVar202._16_4_ * 0.0;
        auVar42._20_4_ = -auVar202._20_4_ * 0.0;
        auVar42._24_4_ = -auVar202._24_4_ * 0.0;
        auVar42._28_4_ = auVar202._28_4_ ^ 0x80000000;
        auVar218 = vfmadd213ps_fma(auVar128,auVar128,ZEXT832(0) << 0x20);
        auVar218 = vfmadd231ps_fma(ZEXT1632(auVar218),auVar150,auVar150);
        auVar202 = vrsqrtps_avx(ZEXT1632(auVar218));
        auVar177 = ZEXT1632(CONCAT412(fVar205 * 0.0,
                                      CONCAT48(fVar204 * 0.0,CONCAT44(fVar203 * 0.0,fVar160 * 0.0)))
                           );
        fVar160 = auVar202._0_4_;
        fVar203 = auVar202._4_4_;
        fVar204 = auVar202._8_4_;
        fVar205 = auVar202._12_4_;
        fVar206 = auVar202._16_4_;
        fVar207 = auVar202._20_4_;
        fVar208 = auVar202._24_4_;
        auVar43._4_4_ = fVar203 * fVar203 * auVar218._4_4_ * -0.5 * fVar203;
        auVar43._0_4_ = fVar160 * fVar160 * auVar218._0_4_ * -0.5 * fVar160;
        auVar43._8_4_ = fVar204 * fVar204 * auVar218._8_4_ * -0.5 * fVar204;
        auVar43._12_4_ = fVar205 * fVar205 * auVar218._12_4_ * -0.5 * fVar205;
        auVar43._16_4_ = fVar206 * fVar206 * fVar206 * -0.0;
        auVar43._20_4_ = fVar207 * fVar207 * fVar207 * -0.0;
        auVar43._24_4_ = fVar208 * fVar208 * fVar208 * -0.0;
        auVar43._28_4_ = 0xbf000000;
        auVar218 = vfmadd231ps_fma(auVar43,auVar244,auVar202);
        fVar160 = auVar218._0_4_;
        fVar203 = auVar218._4_4_;
        auVar44._4_4_ = fVar203 * auVar150._4_4_;
        auVar44._0_4_ = fVar160 * auVar150._0_4_;
        fVar204 = auVar218._8_4_;
        auVar44._8_4_ = fVar204 * auVar150._8_4_;
        fVar205 = auVar218._12_4_;
        auVar44._12_4_ = fVar205 * auVar150._12_4_;
        auVar44._16_4_ = auVar150._16_4_ * 0.0;
        auVar44._20_4_ = auVar150._20_4_ * 0.0;
        auVar44._24_4_ = auVar150._24_4_ * 0.0;
        auVar44._28_4_ = 0;
        auVar45._4_4_ = fVar203 * -auVar128._4_4_;
        auVar45._0_4_ = fVar160 * -auVar128._0_4_;
        auVar45._8_4_ = fVar204 * -auVar128._8_4_;
        auVar45._12_4_ = fVar205 * -auVar128._12_4_;
        auVar45._16_4_ = -auVar128._16_4_ * 0.0;
        auVar45._20_4_ = -auVar128._20_4_ * 0.0;
        auVar45._24_4_ = -auVar128._24_4_ * 0.0;
        auVar45._28_4_ = 0;
        auVar46._28_4_ = auVar202._28_4_;
        auVar46._0_28_ =
             ZEXT1628(CONCAT412(fVar205 * 0.0,
                                CONCAT48(fVar204 * 0.0,CONCAT44(fVar203 * 0.0,fVar160 * 0.0))));
        auVar218 = vfmadd213ps_fma(auVar41,ZEXT1632(auVar22),local_380);
        auVar128 = ZEXT1632(auVar22);
        auVar209 = vfmadd213ps_fma(auVar42,auVar128,auVar130);
        auVar210 = vfmadd213ps_fma(auVar177,auVar128,ZEXT1632(auVar125));
        auVar26 = vfnmadd213ps_fma(auVar41,auVar128,local_380);
        auVar219 = vfmadd213ps_fma(auVar44,ZEXT1632(auVar190),auVar145);
        auVar27 = vfnmadd213ps_fma(auVar42,auVar128,auVar130);
        auVar128 = ZEXT1632(auVar190);
        auVar220 = vfmadd213ps_fma(auVar45,auVar128,auVar171);
        auVar213 = ZEXT1632(auVar22);
        auVar236 = vfnmadd231ps_fma(ZEXT1632(auVar125),auVar213,auVar177);
        auVar125 = vfmadd213ps_fma(auVar46,auVar128,ZEXT1632(auVar15));
        auVar230 = vfnmadd213ps_fma(auVar44,auVar128,auVar145);
        auVar234 = vfnmadd213ps_fma(auVar45,auVar128,auVar171);
        auVar127 = vfnmadd231ps_fma(ZEXT1632(auVar15),ZEXT1632(auVar190),auVar46);
        auVar128 = vsubps_avx(ZEXT1632(auVar220),ZEXT1632(auVar27));
        auVar150 = vsubps_avx(ZEXT1632(auVar125),ZEXT1632(auVar236));
        auVar172._0_4_ = auVar236._0_4_ * auVar128._0_4_;
        auVar172._4_4_ = auVar236._4_4_ * auVar128._4_4_;
        auVar172._8_4_ = auVar236._8_4_ * auVar128._8_4_;
        auVar172._12_4_ = auVar236._12_4_ * auVar128._12_4_;
        auVar172._16_4_ = auVar128._16_4_ * 0.0;
        auVar172._20_4_ = auVar128._20_4_ * 0.0;
        auVar172._24_4_ = auVar128._24_4_ * 0.0;
        auVar172._28_4_ = 0;
        auVar22 = vfmsub231ps_fma(auVar172,ZEXT1632(auVar27),auVar150);
        auVar47._4_4_ = auVar150._4_4_ * auVar26._4_4_;
        auVar47._0_4_ = auVar150._0_4_ * auVar26._0_4_;
        auVar47._8_4_ = auVar150._8_4_ * auVar26._8_4_;
        auVar47._12_4_ = auVar150._12_4_ * auVar26._12_4_;
        auVar47._16_4_ = auVar150._16_4_ * 0.0;
        auVar47._20_4_ = auVar150._20_4_ * 0.0;
        auVar47._24_4_ = auVar150._24_4_ * 0.0;
        auVar47._28_4_ = auVar150._28_4_;
        auVar150 = vsubps_avx(ZEXT1632(auVar219),ZEXT1632(auVar26));
        auVar15 = vfmsub231ps_fma(auVar47,ZEXT1632(auVar236),auVar150);
        auVar48._4_4_ = auVar27._4_4_ * auVar150._4_4_;
        auVar48._0_4_ = auVar27._0_4_ * auVar150._0_4_;
        auVar48._8_4_ = auVar27._8_4_ * auVar150._8_4_;
        auVar48._12_4_ = auVar27._12_4_ * auVar150._12_4_;
        auVar48._16_4_ = auVar150._16_4_ * 0.0;
        auVar48._20_4_ = auVar150._20_4_ * 0.0;
        auVar48._24_4_ = auVar150._24_4_ * 0.0;
        auVar48._28_4_ = auVar150._28_4_;
        auVar198 = ZEXT1632(auVar26);
        auVar26 = vfmsub231ps_fma(auVar48,auVar198,auVar128);
        auVar15 = vfmadd231ps_fma(ZEXT1632(auVar26),ZEXT832(0) << 0x20,ZEXT1632(auVar15));
        auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),ZEXT832(0) << 0x20,ZEXT1632(auVar22));
        auVar174 = vcmpps_avx(ZEXT1632(auVar15),ZEXT832(0) << 0x20,2);
        auVar128 = vblendvps_avx(ZEXT1632(auVar230),ZEXT1632(auVar218),auVar174);
        auVar150 = vblendvps_avx(ZEXT1632(auVar234),ZEXT1632(auVar209),auVar174);
        auVar202 = vblendvps_avx(ZEXT1632(auVar127),ZEXT1632(auVar210),auVar174);
        auVar177 = vblendvps_avx(auVar198,ZEXT1632(auVar219),auVar174);
        auVar24 = vblendvps_avx(ZEXT1632(auVar27),ZEXT1632(auVar220),auVar174);
        auVar228 = vblendvps_avx(ZEXT1632(auVar236),ZEXT1632(auVar125),auVar174);
        auVar198 = vblendvps_avx(ZEXT1632(auVar219),auVar198,auVar174);
        auVar139 = vblendvps_avx(ZEXT1632(auVar220),ZEXT1632(auVar27),auVar174);
        auVar15 = vpackssdw_avx(local_3a0._0_16_,local_3a0._16_16_);
        auVar23 = vblendvps_avx(ZEXT1632(auVar125),ZEXT1632(auVar236),auVar174);
        auVar130 = vsubps_avx(auVar198,auVar128);
        auVar145 = vsubps_avx(auVar139,auVar150);
        auVar171 = vsubps_avx(auVar23,auVar202);
        auVar176 = vsubps_avx(auVar128,auVar177);
        auVar225 = vsubps_avx(auVar150,auVar24);
        auVar243 = vsubps_avx(auVar202,auVar228);
        auVar49._4_4_ = auVar171._4_4_ * auVar128._4_4_;
        auVar49._0_4_ = auVar171._0_4_ * auVar128._0_4_;
        auVar49._8_4_ = auVar171._8_4_ * auVar128._8_4_;
        auVar49._12_4_ = auVar171._12_4_ * auVar128._12_4_;
        auVar49._16_4_ = auVar171._16_4_ * auVar128._16_4_;
        auVar49._20_4_ = auVar171._20_4_ * auVar128._20_4_;
        auVar49._24_4_ = auVar171._24_4_ * auVar128._24_4_;
        auVar49._28_4_ = auVar23._28_4_;
        auVar125 = vfmsub231ps_fma(auVar49,auVar202,auVar130);
        auVar50._4_4_ = auVar150._4_4_ * auVar130._4_4_;
        auVar50._0_4_ = auVar150._0_4_ * auVar130._0_4_;
        auVar50._8_4_ = auVar150._8_4_ * auVar130._8_4_;
        auVar50._12_4_ = auVar150._12_4_ * auVar130._12_4_;
        auVar50._16_4_ = auVar150._16_4_ * auVar130._16_4_;
        auVar50._20_4_ = auVar150._20_4_ * auVar130._20_4_;
        auVar50._24_4_ = auVar150._24_4_ * auVar130._24_4_;
        auVar50._28_4_ = auVar198._28_4_;
        auVar218 = vfmsub231ps_fma(auVar50,auVar128,auVar145);
        auVar125 = vfmadd231ps_fma(ZEXT1632(auVar218),ZEXT832(0) << 0x20,ZEXT1632(auVar125));
        auVar134._0_4_ = auVar145._0_4_ * auVar202._0_4_;
        auVar134._4_4_ = auVar145._4_4_ * auVar202._4_4_;
        auVar134._8_4_ = auVar145._8_4_ * auVar202._8_4_;
        auVar134._12_4_ = auVar145._12_4_ * auVar202._12_4_;
        auVar134._16_4_ = auVar145._16_4_ * auVar202._16_4_;
        auVar134._20_4_ = auVar145._20_4_ * auVar202._20_4_;
        auVar134._24_4_ = auVar145._24_4_ * auVar202._24_4_;
        auVar134._28_4_ = 0;
        auVar218 = vfmsub231ps_fma(auVar134,auVar150,auVar171);
        auVar218 = vfmadd231ps_fma(ZEXT1632(auVar125),ZEXT832(0) << 0x20,ZEXT1632(auVar218));
        auVar181 = ZEXT1664(auVar218);
        auVar135._0_4_ = auVar243._0_4_ * auVar177._0_4_;
        auVar135._4_4_ = auVar243._4_4_ * auVar177._4_4_;
        auVar135._8_4_ = auVar243._8_4_ * auVar177._8_4_;
        auVar135._12_4_ = auVar243._12_4_ * auVar177._12_4_;
        auVar135._16_4_ = auVar243._16_4_ * auVar177._16_4_;
        auVar135._20_4_ = auVar243._20_4_ * auVar177._20_4_;
        auVar135._24_4_ = auVar243._24_4_ * auVar177._24_4_;
        auVar135._28_4_ = 0;
        auVar125 = vfmsub231ps_fma(auVar135,auVar176,auVar228);
        auVar51._4_4_ = auVar225._4_4_ * auVar228._4_4_;
        auVar51._0_4_ = auVar225._0_4_ * auVar228._0_4_;
        auVar51._8_4_ = auVar225._8_4_ * auVar228._8_4_;
        auVar51._12_4_ = auVar225._12_4_ * auVar228._12_4_;
        auVar51._16_4_ = auVar225._16_4_ * auVar228._16_4_;
        auVar51._20_4_ = auVar225._20_4_ * auVar228._20_4_;
        auVar51._24_4_ = auVar225._24_4_ * auVar228._24_4_;
        auVar51._28_4_ = auVar228._28_4_;
        auVar22 = vfmsub231ps_fma(auVar51,auVar24,auVar243);
        auVar52._4_4_ = auVar176._4_4_ * auVar24._4_4_;
        auVar52._0_4_ = auVar176._0_4_ * auVar24._0_4_;
        auVar52._8_4_ = auVar176._8_4_ * auVar24._8_4_;
        auVar52._12_4_ = auVar176._12_4_ * auVar24._12_4_;
        auVar52._16_4_ = auVar176._16_4_ * auVar24._16_4_;
        auVar52._20_4_ = auVar176._20_4_ * auVar24._20_4_;
        auVar52._24_4_ = auVar176._24_4_ * auVar24._24_4_;
        auVar52._28_4_ = auVar139._28_4_;
        auVar209 = vfmsub231ps_fma(auVar52,auVar225,auVar177);
        auVar125 = vfmadd231ps_fma(ZEXT1632(auVar209),ZEXT832(0) << 0x20,ZEXT1632(auVar125));
        auVar22 = vfmadd231ps_fma(ZEXT1632(auVar125),ZEXT832(0) << 0x20,ZEXT1632(auVar22));
        auVar177 = vmaxps_avx(ZEXT1632(auVar218),ZEXT1632(auVar22));
        auVar177 = vcmpps_avx(auVar177,ZEXT832(0) << 0x20,2);
        auVar125 = vpackssdw_avx(auVar177._0_16_,auVar177._16_16_);
        auVar15 = vpand_avx(auVar125,auVar15);
        auVar177 = vpmovsxwd_avx2(auVar15);
        if ((((((((auVar177 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar177 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar177 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar177 >> 0x7f,0) == '\0') &&
              (auVar177 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar177 >> 0xbf,0) == '\0') &&
            (auVar177 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar177[0x1f]) {
LAB_018ad10e:
          auVar216 = ZEXT3264(CONCAT824(uStack_608,
                                        CONCAT816(uStack_610,CONCAT88(uStack_618,local_620))));
          auVar232 = ZEXT3264(auVar137);
          auVar229 = ZEXT3264(auVar141);
        }
        else {
          auVar53._4_4_ = auVar145._4_4_ * auVar243._4_4_;
          auVar53._0_4_ = auVar145._0_4_ * auVar243._0_4_;
          auVar53._8_4_ = auVar145._8_4_ * auVar243._8_4_;
          auVar53._12_4_ = auVar145._12_4_ * auVar243._12_4_;
          auVar53._16_4_ = auVar145._16_4_ * auVar243._16_4_;
          auVar53._20_4_ = auVar145._20_4_ * auVar243._20_4_;
          auVar53._24_4_ = auVar145._24_4_ * auVar243._24_4_;
          auVar53._28_4_ = auVar177._28_4_;
          auVar219 = vfmsub231ps_fma(auVar53,auVar225,auVar171);
          auVar148._0_4_ = auVar171._0_4_ * auVar176._0_4_;
          auVar148._4_4_ = auVar171._4_4_ * auVar176._4_4_;
          auVar148._8_4_ = auVar171._8_4_ * auVar176._8_4_;
          auVar148._12_4_ = auVar171._12_4_ * auVar176._12_4_;
          auVar148._16_4_ = auVar171._16_4_ * auVar176._16_4_;
          auVar148._20_4_ = auVar171._20_4_ * auVar176._20_4_;
          auVar148._24_4_ = auVar171._24_4_ * auVar176._24_4_;
          auVar148._28_4_ = 0;
          auVar210 = vfmsub231ps_fma(auVar148,auVar130,auVar243);
          auVar54._4_4_ = auVar225._4_4_ * auVar130._4_4_;
          auVar54._0_4_ = auVar225._0_4_ * auVar130._0_4_;
          auVar54._8_4_ = auVar225._8_4_ * auVar130._8_4_;
          auVar54._12_4_ = auVar225._12_4_ * auVar130._12_4_;
          auVar54._16_4_ = auVar225._16_4_ * auVar130._16_4_;
          auVar54._20_4_ = auVar225._20_4_ * auVar130._20_4_;
          auVar54._24_4_ = auVar225._24_4_ * auVar130._24_4_;
          auVar54._28_4_ = auVar24._28_4_;
          auVar220 = vfmsub231ps_fma(auVar54,auVar176,auVar145);
          auVar125 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar210),ZEXT1632(auVar220));
          auVar209 = vfmadd231ps_fma(ZEXT1632(auVar125),ZEXT1632(auVar219),ZEXT832(0) << 0x20);
          auVar177 = vrcpps_avx(ZEXT1632(auVar209));
          auVar231._8_4_ = 0x3f800000;
          auVar231._0_8_ = &DAT_3f8000003f800000;
          auVar231._12_4_ = 0x3f800000;
          auVar231._16_4_ = 0x3f800000;
          auVar231._20_4_ = 0x3f800000;
          auVar231._24_4_ = 0x3f800000;
          auVar231._28_4_ = 0x3f800000;
          auVar125 = vfnmadd213ps_fma(auVar177,ZEXT1632(auVar209),auVar231);
          auVar125 = vfmadd132ps_fma(ZEXT1632(auVar125),auVar177,auVar177);
          auVar214._0_4_ = auVar220._0_4_ * auVar202._0_4_;
          auVar214._4_4_ = auVar220._4_4_ * auVar202._4_4_;
          auVar214._8_4_ = auVar220._8_4_ * auVar202._8_4_;
          auVar214._12_4_ = auVar220._12_4_ * auVar202._12_4_;
          auVar214._16_4_ = auVar202._16_4_ * 0.0;
          auVar214._20_4_ = auVar202._20_4_ * 0.0;
          auVar214._24_4_ = auVar202._24_4_ * 0.0;
          auVar214._28_4_ = 0;
          auVar210 = vfmadd231ps_fma(auVar214,auVar150,ZEXT1632(auVar210));
          auVar210 = vfmadd231ps_fma(ZEXT1632(auVar210),ZEXT1632(auVar219),auVar128);
          fVar160 = auVar125._0_4_;
          fVar203 = auVar125._4_4_;
          fVar204 = auVar125._8_4_;
          fVar205 = auVar125._12_4_;
          auVar202 = ZEXT1632(CONCAT412(fVar205 * auVar210._12_4_,
                                        CONCAT48(fVar204 * auVar210._8_4_,
                                                 CONCAT44(fVar203 * auVar210._4_4_,
                                                          fVar160 * auVar210._0_4_))));
          auVar136._4_4_ = uVar119;
          auVar136._0_4_ = uVar119;
          auVar136._8_4_ = uVar119;
          auVar136._12_4_ = uVar119;
          auVar136._16_4_ = uVar119;
          auVar136._20_4_ = uVar119;
          auVar136._24_4_ = uVar119;
          auVar136._28_4_ = uVar119;
          uVar123 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar149._4_4_ = uVar123;
          auVar149._0_4_ = uVar123;
          auVar149._8_4_ = uVar123;
          auVar149._12_4_ = uVar123;
          auVar149._16_4_ = uVar123;
          auVar149._20_4_ = uVar123;
          auVar149._24_4_ = uVar123;
          auVar149._28_4_ = uVar123;
          auVar128 = vcmpps_avx(auVar136,auVar202,2);
          auVar150 = vcmpps_avx(auVar202,auVar149,2);
          auVar128 = vandps_avx(auVar150,auVar128);
          auVar125 = vpackssdw_avx(auVar128._0_16_,auVar128._16_16_);
          auVar15 = vpand_avx(auVar15,auVar125);
          auVar128 = vpmovsxwd_avx2(auVar15);
          if ((((((((auVar128 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar128 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar128 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar128 >> 0x7f,0) == '\0') &&
                (auVar128 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar128 >> 0xbf,0) == '\0') &&
              (auVar128 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar128[0x1f]) goto LAB_018ad10e;
          auVar128 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT1632(auVar209),4);
          auVar125 = vpackssdw_avx(auVar128._0_16_,auVar128._16_16_);
          auVar15 = vpand_avx(auVar15,auVar125);
          auVar128 = vpmovsxwd_avx2(auVar15);
          auVar216 = ZEXT3264(CONCAT824(uStack_608,
                                        CONCAT816(uStack_610,CONCAT88(uStack_618,local_620))));
          auVar232 = ZEXT3264(auVar137);
          auVar229 = ZEXT3264(auVar141);
          if ((((((((auVar128 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar128 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar128 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar128 >> 0x7f,0) != '\0') ||
                (auVar128 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar128 >> 0xbf,0) != '\0') ||
              (auVar128 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar128[0x1f] < '\0') {
            auVar137 = ZEXT1632(CONCAT412(fVar205 * auVar218._12_4_,
                                          CONCAT48(fVar204 * auVar218._8_4_,
                                                   CONCAT44(fVar203 * auVar218._4_4_,
                                                            fVar160 * auVar218._0_4_))));
            auVar150 = ZEXT1632(CONCAT412(fVar205 * auVar22._12_4_,
                                          CONCAT48(fVar204 * auVar22._8_4_,
                                                   CONCAT44(fVar203 * auVar22._4_4_,
                                                            fVar160 * auVar22._0_4_))));
            auVar195._8_4_ = 0x3f800000;
            auVar195._0_8_ = &DAT_3f8000003f800000;
            auVar195._12_4_ = 0x3f800000;
            auVar195._16_4_ = 0x3f800000;
            auVar195._20_4_ = 0x3f800000;
            auVar195._24_4_ = 0x3f800000;
            auVar195._28_4_ = 0x3f800000;
            auVar141 = vsubps_avx(auVar195,auVar137);
            auVar181 = ZEXT3264(auVar141);
            auVar141 = vblendvps_avx(auVar141,auVar137,auVar174);
            auVar232 = ZEXT3264(auVar141);
            auVar141 = vsubps_avx(auVar195,auVar150);
            local_3c0 = vblendvps_avx(auVar141,auVar150,auVar174);
            auVar216 = ZEXT3264(auVar128);
            auVar229 = ZEXT3264(auVar202);
          }
        }
        auVar239 = ZEXT3264(_local_700);
        auVar128 = auVar216._0_32_;
        if ((((((((auVar128 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar128 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar128 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar128 >> 0x7f,0) == '\0') &&
              (auVar216 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
             SUB321(auVar128 >> 0xbf,0) == '\0') &&
            (auVar216 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
            -1 < auVar216[0x1f]) {
          auVar159 = ZEXT3264(local_720);
          auVar221 = ZEXT3264(CONCAT428(local_7a0,
                                        CONCAT424(local_7a0,
                                                  CONCAT420(local_7a0,
                                                            CONCAT416(local_7a0,
                                                                      CONCAT412(local_7a0,
                                                                                CONCAT48(local_7a0,
                                                                                         CONCAT44(
                                                  local_7a0,local_7a0))))))));
          auVar224 = ZEXT3264(local_7c0);
          auVar216 = ZEXT3264(local_780);
        }
        else {
          auVar141 = vsubps_avx(ZEXT1632(auVar190),auVar213);
          auVar202 = auVar232._0_32_;
          auVar15 = vfmadd213ps_fma(auVar141,auVar202,auVar213);
          fVar160 = *(float *)((long)pre->ray_space + k * 4 + -0x20);
          auVar141._4_4_ = (auVar15._4_4_ + auVar15._4_4_) * fVar160;
          auVar141._0_4_ = (auVar15._0_4_ + auVar15._0_4_) * fVar160;
          auVar141._8_4_ = (auVar15._8_4_ + auVar15._8_4_) * fVar160;
          auVar141._12_4_ = (auVar15._12_4_ + auVar15._12_4_) * fVar160;
          auVar141._16_4_ = fVar160 * 0.0;
          auVar141._20_4_ = fVar160 * 0.0;
          auVar141._24_4_ = fVar160 * 0.0;
          auVar141._28_4_ = 0;
          auVar150 = auVar229._0_32_;
          auVar141 = vcmpps_avx(auVar150,auVar141,6);
          auVar137 = auVar128 & auVar141;
          auVar221 = ZEXT3264(CONCAT428(local_7a0,
                                        CONCAT424(local_7a0,
                                                  CONCAT420(local_7a0,
                                                            CONCAT416(local_7a0,
                                                                      CONCAT412(local_7a0,
                                                                                CONCAT48(local_7a0,
                                                                                         CONCAT44(
                                                  local_7a0,local_7a0))))))));
          auVar224 = ZEXT3264(local_7c0);
          auVar216 = ZEXT3264(local_780);
          if ((((((((auVar137 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar137 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar137 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar137 >> 0x7f,0) != '\0') ||
                (auVar137 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar137 >> 0xbf,0) != '\0') ||
              (auVar137 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar137[0x1f] < '\0') {
            local_460 = vandps_avx(auVar141,auVar128);
            auVar151._8_4_ = 0xbf800000;
            auVar151._0_8_ = 0xbf800000bf800000;
            auVar151._12_4_ = 0xbf800000;
            auVar151._16_4_ = 0xbf800000;
            auVar151._20_4_ = 0xbf800000;
            auVar151._24_4_ = 0xbf800000;
            auVar151._28_4_ = 0xbf800000;
            auVar173._8_4_ = 0x40000000;
            auVar173._0_8_ = 0x4000000040000000;
            auVar173._12_4_ = 0x40000000;
            auVar173._16_4_ = 0x40000000;
            auVar173._20_4_ = 0x40000000;
            auVar173._24_4_ = 0x40000000;
            auVar173._28_4_ = 0x40000000;
            auVar181 = ZEXT3264(auVar173);
            auVar15 = vfmadd213ps_fma(local_3c0,auVar173,auVar151);
            local_500 = ZEXT1632(auVar15);
            local_3c0 = local_500;
            auVar128 = local_3c0;
            local_4c0 = 0;
            local_3c0 = auVar128;
            if ((pGVar18->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
              fVar160 = 1.0 / auVar132._0_4_;
              local_440[0] = fVar160 * (auVar232._0_4_ + 0.0);
              local_440[1] = fVar160 * (auVar232._4_4_ + 1.0);
              local_440[2] = fVar160 * (auVar232._8_4_ + 2.0);
              local_440[3] = fVar160 * (auVar232._12_4_ + 3.0);
              fStack_430 = fVar160 * (auVar232._16_4_ + 4.0);
              fStack_42c = fVar160 * (auVar232._20_4_ + 5.0);
              fStack_428 = fVar160 * (auVar232._24_4_ + 6.0);
              fStack_424 = auVar232._28_4_ + 7.0;
              local_3c0._0_8_ = auVar15._0_8_;
              local_3c0._8_8_ = auVar15._8_8_;
              local_420 = local_3c0._0_8_;
              uStack_418 = local_3c0._8_8_;
              uStack_410 = 0;
              uStack_408 = 0;
              local_400 = auVar150;
              auVar152._8_4_ = 0x7f800000;
              auVar152._0_8_ = 0x7f8000007f800000;
              auVar152._12_4_ = 0x7f800000;
              auVar152._16_4_ = 0x7f800000;
              auVar152._20_4_ = 0x7f800000;
              auVar152._24_4_ = 0x7f800000;
              auVar152._28_4_ = 0x7f800000;
              auVar128 = vblendvps_avx(auVar152,auVar150,local_460);
              auVar141 = vshufps_avx(auVar128,auVar128,0xb1);
              auVar141 = vminps_avx(auVar128,auVar141);
              auVar137 = vshufpd_avx(auVar141,auVar141,5);
              auVar141 = vminps_avx(auVar141,auVar137);
              auVar137 = vpermpd_avx2(auVar141,0x4e);
              auVar141 = vminps_avx(auVar141,auVar137);
              auVar141 = vcmpps_avx(auVar128,auVar141,0);
              auVar137 = local_460 & auVar141;
              auVar128 = local_460;
              if ((((((((auVar137 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar137 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar137 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar137 >> 0x7f,0) != '\0') ||
                    (auVar137 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar137 >> 0xbf,0) != '\0') ||
                  (auVar137 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar137[0x1f] < '\0') {
                auVar128 = vandps_avx(auVar141,local_460);
              }
              uVar117 = vmovmskps_avx(auVar128);
              uVar119 = 0;
              for (; (uVar117 & 1) == 0; uVar117 = uVar117 >> 1 | 0x80000000) {
                uVar119 = uVar119 + 1;
              }
              uVar118 = (ulong)uVar119;
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar18->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                fVar160 = local_440[uVar118];
                fVar203 = 1.0 - fVar160;
                auVar125 = ZEXT416((uint)fVar160);
                auVar20 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar125,
                                          ZEXT416(0xc0a00000));
                auVar15 = vfmadd231ss_fma(ZEXT416((uint)(fVar160 * fVar160 * 3.0)),
                                          ZEXT416((uint)(fVar160 + fVar160)),auVar20);
                auVar20 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar125,
                                          ZEXT416(0x40000000));
                auVar20 = vfmadd231ss_fma(ZEXT416((uint)(fVar203 * fVar203 * -3.0)),
                                          ZEXT416((uint)(fVar203 + fVar203)),auVar20);
                auVar218 = vfnmadd231ss_fma(ZEXT416((uint)(fVar160 * (fVar203 + fVar203))),
                                            ZEXT416((uint)fVar203),ZEXT416((uint)fVar203));
                auVar125 = vfmadd231ss_fma(ZEXT416((uint)(fVar160 * fVar160)),auVar125,
                                           ZEXT416((uint)(fVar203 * -2.0)));
                fVar203 = auVar20._0_4_ * 0.5;
                fVar204 = auVar125._0_4_ * 0.5;
                auVar182._0_4_ = fVar204 * local_820;
                auVar182._4_4_ = fVar204 * fStack_81c;
                auVar182._8_4_ = fVar204 * fStack_818;
                auVar182._12_4_ = fVar204 * fStack_814;
                auVar143._4_4_ = fVar203;
                auVar143._0_4_ = fVar203;
                auVar143._8_4_ = fVar203;
                auVar143._12_4_ = fVar203;
                auVar20 = vfmadd132ps_fma(auVar143,auVar182,*pauVar3);
                fVar203 = auVar15._0_4_ * 0.5;
                auVar183._4_4_ = fVar203;
                auVar183._0_4_ = fVar203;
                auVar183._8_4_ = fVar203;
                auVar183._12_4_ = fVar203;
                auVar20 = vfmadd132ps_fma(auVar183,auVar20,*pauVar2);
                uVar123 = *(undefined4 *)((long)&local_420 + uVar118 * 4);
                fVar203 = auVar218._0_4_ * 0.5;
                auVar216 = ZEXT3264(local_780);
                auVar162._4_4_ = fVar203;
                auVar162._0_4_ = fVar203;
                auVar162._8_4_ = fVar203;
                auVar162._12_4_ = fVar203;
                auVar20 = vfmadd132ps_fma(auVar162,auVar20,*pauVar1);
                auVar181 = ZEXT1664(auVar20);
                *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_400 + uVar118 * 4);
                *(int *)(ray + k * 4 + 0x180) = auVar20._0_4_;
                uVar233 = vextractps_avx(auVar20,1);
                *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar233;
                uVar233 = vextractps_avx(auVar20,2);
                *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar233;
                *(float *)(ray + k * 4 + 0x1e0) = fVar160;
                *(undefined4 *)(ray + k * 4 + 0x200) = uVar123;
                *(uint *)(ray + k * 4 + 0x220) = uVar17;
                *(uint *)(ray + k * 4 + 0x240) = uVar115;
                *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
              }
              else {
                local_840 = CONCAT44(uVar115,uVar115);
                uStack_838._0_4_ = uVar115;
                uStack_838._4_4_ = uVar115;
                uStack_830._0_4_ = uVar115;
                uStack_830._4_4_ = uVar115;
                auVar114 = _local_840;
                uStack_828._0_4_ = uVar115;
                uStack_828._4_4_ = uVar115;
                auVar128 = _local_840;
                local_6e0._4_4_ = uVar17;
                local_6e0._0_4_ = uVar17;
                uStack_6d8._0_4_ = (float)uVar17;
                uStack_6d8._4_4_ = (float)uVar17;
                uStack_6d0._0_4_ = uVar17;
                uStack_6d0._4_4_ = uVar17;
                uStack_6c8._0_4_ = uVar17;
                uStack_6c8._4_4_ = uVar17;
                local_6c0 = ZEXT1632(*pauVar2);
                local_5c0 = ZEXT1632(*pauVar3);
                _local_5e0 = ZEXT1632(*pauVar4);
                local_680 = local_460;
                _local_600 = auVar153;
                local_520 = auVar202;
                local_4e0 = auVar150;
                local_4bc = iVar116;
                local_4b0 = uVar217;
                uStack_4a8 = uVar100;
                local_4a0 = uVar101;
                uStack_498 = uVar102;
                local_490 = uVar103;
                uStack_488 = uVar104;
                local_480 = uVar105;
                uStack_478 = uVar106;
                do {
                  uVar123 = *(undefined4 *)(ray + k * 4 + 0x100);
                  fVar160 = local_440[uVar118];
                  auVar127._4_4_ = fVar160;
                  auVar127._0_4_ = fVar160;
                  auVar127._8_4_ = fVar160;
                  auVar127._12_4_ = fVar160;
                  local_280._16_4_ = fVar160;
                  local_280._0_16_ = auVar127;
                  local_280._20_4_ = fVar160;
                  local_280._24_4_ = fVar160;
                  local_280._28_4_ = fVar160;
                  uVar233 = *(undefined4 *)((long)&local_420 + uVar118 * 4);
                  local_260._4_4_ = uVar233;
                  local_260._0_4_ = uVar233;
                  local_260._8_4_ = uVar233;
                  local_260._12_4_ = uVar233;
                  local_260._16_4_ = uVar233;
                  local_260._20_4_ = uVar233;
                  local_260._24_4_ = uVar233;
                  local_260._28_4_ = uVar233;
                  *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_400 + uVar118 * 4);
                  fVar203 = 1.0 - fVar160;
                  auVar15 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar127,
                                            ZEXT416(0xc0a00000));
                  auVar125 = vfmadd231ss_fma(ZEXT416((uint)(fVar160 * fVar160 * 3.0)),
                                             ZEXT416((uint)(fVar160 + fVar160)),auVar15);
                  auVar15 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar127,
                                            ZEXT416(0x40000000));
                  auVar15 = vfmadd231ss_fma(ZEXT416((uint)(fVar203 * fVar203 * -3.0)),
                                            ZEXT416((uint)(fVar203 + fVar203)),auVar15);
                  auVar22 = vfnmadd231ss_fma(ZEXT416((uint)(fVar160 * (fVar203 + fVar203))),
                                             ZEXT416((uint)fVar203),ZEXT416((uint)fVar203));
                  auVar218 = vfmadd231ss_fma(ZEXT416((uint)(fVar160 * fVar160)),auVar127,
                                             ZEXT416((uint)(fVar203 * -2.0)));
                  fVar160 = auVar15._0_4_ * 0.5;
                  fVar203 = auVar218._0_4_ * 0.5;
                  auVar193._0_4_ = fVar203 * (float)local_5e0._0_4_;
                  auVar193._4_4_ = fVar203 * (float)local_5e0._4_4_;
                  auVar193._8_4_ = fVar203 * fStack_5d8;
                  auVar193._12_4_ = fVar203 * fStack_5d4;
                  auVar167._4_4_ = fVar160;
                  auVar167._0_4_ = fVar160;
                  auVar167._8_4_ = fVar160;
                  auVar167._12_4_ = fVar160;
                  auVar15 = vfmadd132ps_fma(auVar167,auVar193,local_5c0._0_16_);
                  fVar160 = auVar125._0_4_ * 0.5;
                  auVar194._4_4_ = fVar160;
                  auVar194._0_4_ = fVar160;
                  auVar194._8_4_ = fVar160;
                  auVar194._12_4_ = fVar160;
                  auVar15 = vfmadd132ps_fma(auVar194,auVar15,local_6c0._0_16_);
                  local_7f0.context = context->user;
                  fVar160 = auVar22._0_4_ * 0.5;
                  auVar168._4_4_ = fVar160;
                  auVar168._0_4_ = fVar160;
                  auVar168._8_4_ = fVar160;
                  auVar168._12_4_ = fVar160;
                  auVar125 = vfmadd132ps_fma(auVar168,auVar15,auVar20);
                  local_2e0 = auVar125._0_4_;
                  uStack_2dc = local_2e0;
                  uStack_2d8 = local_2e0;
                  uStack_2d4 = local_2e0;
                  uStack_2d0 = local_2e0;
                  uStack_2cc = local_2e0;
                  uStack_2c8 = local_2e0;
                  uStack_2c4 = local_2e0;
                  auVar15 = vmovshdup_avx(auVar125);
                  local_2c0._8_8_ = auVar15._0_8_;
                  local_2c0._0_8_ = local_2c0._8_8_;
                  local_2c0._16_8_ = local_2c0._8_8_;
                  local_2c0._24_8_ = local_2c0._8_8_;
                  auVar15 = vshufps_avx(auVar125,auVar125,0xaa);
                  auVar169._0_8_ = auVar15._0_8_;
                  auVar169._8_8_ = auVar169._0_8_;
                  auVar180._16_8_ = auVar169._0_8_;
                  auVar180._0_16_ = auVar169;
                  auVar180._24_8_ = auVar169._0_8_;
                  local_2a0 = auVar180;
                  local_240 = local_6e0;
                  uStack_238 = uStack_6d8;
                  uStack_230 = uStack_6d0;
                  uStack_228 = uStack_6c8;
                  uStack_830 = auVar114._16_8_;
                  uStack_828 = auVar128._24_8_;
                  local_220 = local_840;
                  uStack_218 = uStack_838;
                  uStack_210 = uStack_830;
                  uStack_208 = uStack_828;
                  auVar141 = vpcmpeqd_avx2(local_260,local_260);
                  local_748[1] = auVar141;
                  *local_748 = auVar141;
                  local_200 = (local_7f0.context)->instID[0];
                  uStack_1fc = local_200;
                  uStack_1f8 = local_200;
                  uStack_1f4 = local_200;
                  uStack_1f0 = local_200;
                  uStack_1ec = local_200;
                  uStack_1e8 = local_200;
                  uStack_1e4 = local_200;
                  local_1e0 = (local_7f0.context)->instPrimID[0];
                  uStack_1dc = local_1e0;
                  uStack_1d8 = local_1e0;
                  uStack_1d4 = local_1e0;
                  uStack_1d0 = local_1e0;
                  uStack_1cc = local_1e0;
                  uStack_1c8 = local_1e0;
                  uStack_1c4 = local_1e0;
                  local_660 = local_340._0_8_;
                  uStack_658 = local_340._8_8_;
                  uStack_650 = local_340._16_8_;
                  uStack_648 = local_340._24_8_;
                  local_7f0.valid = (int *)&local_660;
                  local_7f0.geometryUserPtr = pGVar18->userPtr;
                  local_7f0.hit = (RTCHitN *)&local_2e0;
                  local_7f0.N = 8;
                  local_7f0.ray = (RTCRayN *)ray;
                  if (pGVar18->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    auVar180 = ZEXT1632(auVar169);
                    (*pGVar18->intersectionFilterN)(&local_7f0);
                    auVar181._8_56_ = extraout_var_00;
                    auVar181._0_8_ = extraout_XMM1_Qa_00;
                    auVar239 = ZEXT3264(_local_700);
                    auVar224 = ZEXT3264(local_7c0);
                    auVar229 = ZEXT3264(auVar150);
                    auVar232 = ZEXT3264(auVar202);
                    auVar141 = vpcmpeqd_avx2(auVar181._0_32_,auVar181._0_32_);
                  }
                  auVar109._8_8_ = uStack_658;
                  auVar109._0_8_ = local_660;
                  auVar109._16_8_ = uStack_650;
                  auVar109._24_8_ = uStack_648;
                  auVar177 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar109);
                  auVar137 = auVar141 & ~auVar177;
                  if ((((((((auVar137 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (auVar137 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar137 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar137 >> 0x7f,0) == '\0') &&
                        (auVar137 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(auVar137 >> 0xbf,0) == '\0') &&
                      (auVar137 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < auVar137[0x1f]) {
                    auVar181 = ZEXT3264(auVar177 ^ auVar141);
                    auVar221 = ZEXT3264(CONCAT428(fStack_784,
                                                  CONCAT424(fStack_788,
                                                            CONCAT420(fStack_78c,
                                                                      CONCAT416(fStack_790,
                                                                                CONCAT412(fStack_794
                                                                                          ,CONCAT48(
                                                  fStack_798,CONCAT44(fStack_79c,local_7a0))))))));
                    auVar216 = ZEXT3264(local_780);
                  }
                  else {
                    p_Var19 = context->args->filter;
                    if ((p_Var19 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar18->field_8).field_0x2 & 0x40) != 0)))) {
                      auVar180 = ZEXT1632(auVar180._0_16_);
                      (*p_Var19)(&local_7f0);
                      auVar239 = ZEXT3264(_local_700);
                      auVar224 = ZEXT3264(local_7c0);
                      auVar229 = ZEXT3264(auVar150);
                      auVar232 = ZEXT3264(auVar202);
                    }
                    auVar110._8_8_ = uStack_658;
                    auVar110._0_8_ = local_660;
                    auVar110._16_8_ = uStack_650;
                    auVar110._24_8_ = uStack_648;
                    auVar137 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar110);
                    auVar177 = vpcmpeqd_avx2(auVar180,auVar180);
                    auVar181 = ZEXT3264(auVar137 ^ auVar177);
                    auVar141 = auVar177 & ~auVar137;
                    auVar221 = ZEXT3264(CONCAT428(fStack_784,
                                                  CONCAT424(fStack_788,
                                                            CONCAT420(fStack_78c,
                                                                      CONCAT416(fStack_790,
                                                                                CONCAT412(fStack_794
                                                                                          ,CONCAT48(
                                                  fStack_798,CONCAT44(fStack_79c,local_7a0))))))));
                    auVar216 = ZEXT3264(local_780);
                    if ((((((((auVar141 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar141 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar141 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar141 >> 0x7f,0) != '\0') ||
                          (auVar141 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar141 >> 0xbf,0) != '\0') ||
                        (auVar141 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar141[0x1f] < '\0') {
                      auVar157._0_4_ = auVar137._0_4_ ^ auVar177._0_4_;
                      auVar157._4_4_ = auVar137._4_4_ ^ auVar177._4_4_;
                      auVar157._8_4_ = auVar137._8_4_ ^ auVar177._8_4_;
                      auVar157._12_4_ = auVar137._12_4_ ^ auVar177._12_4_;
                      auVar157._16_4_ = auVar137._16_4_ ^ auVar177._16_4_;
                      auVar157._20_4_ = auVar137._20_4_ ^ auVar177._20_4_;
                      auVar157._24_4_ = auVar137._24_4_ ^ auVar177._24_4_;
                      auVar157._28_4_ = auVar137._28_4_ ^ auVar177._28_4_;
                      auVar141 = vmaskmovps_avx(auVar157,*(undefined1 (*) [32])local_7f0.hit);
                      *(undefined1 (*) [32])(local_7f0.ray + 0x180) = auVar141;
                      auVar141 = vmaskmovps_avx(auVar157,*(undefined1 (*) [32])
                                                          (local_7f0.hit + 0x20));
                      *(undefined1 (*) [32])(local_7f0.ray + 0x1a0) = auVar141;
                      auVar141 = vmaskmovps_avx(auVar157,*(undefined1 (*) [32])
                                                          (local_7f0.hit + 0x40));
                      *(undefined1 (*) [32])(local_7f0.ray + 0x1c0) = auVar141;
                      auVar141 = vmaskmovps_avx(auVar157,*(undefined1 (*) [32])
                                                          (local_7f0.hit + 0x60));
                      *(undefined1 (*) [32])(local_7f0.ray + 0x1e0) = auVar141;
                      auVar141 = vmaskmovps_avx(auVar157,*(undefined1 (*) [32])
                                                          (local_7f0.hit + 0x80));
                      *(undefined1 (*) [32])(local_7f0.ray + 0x200) = auVar141;
                      auVar141 = vpmaskmovd_avx2(auVar157,*(undefined1 (*) [32])
                                                           (local_7f0.hit + 0xa0));
                      *(undefined1 (*) [32])(local_7f0.ray + 0x220) = auVar141;
                      auVar141 = vpmaskmovd_avx2(auVar157,*(undefined1 (*) [32])
                                                           (local_7f0.hit + 0xc0));
                      *(undefined1 (*) [32])(local_7f0.ray + 0x240) = auVar141;
                      auVar141 = vpmaskmovd_avx2(auVar157,*(undefined1 (*) [32])
                                                           (local_7f0.hit + 0xe0));
                      *(undefined1 (*) [32])(local_7f0.ray + 0x260) = auVar141;
                      auVar141 = vpmaskmovd_avx2(auVar157,*(undefined1 (*) [32])
                                                           (local_7f0.hit + 0x100));
                      *(undefined1 (*) [32])(local_7f0.ray + 0x280) = auVar141;
                    }
                  }
                  auVar141 = auVar181._0_32_;
                  if ((((((((auVar141 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (auVar141 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar141 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar141 >> 0x7f,0) == '\0') &&
                        (auVar181 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
                       SUB321(auVar141 >> 0xbf,0) == '\0') &&
                      (auVar181 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
                      -1 < auVar181[0x1f]) {
                    *(undefined4 *)(ray + k * 4 + 0x100) = uVar123;
                  }
                  *(undefined4 *)(local_680 + uVar118 * 4) = 0;
                  uVar123 = *(undefined4 *)(ray + k * 4 + 0x100);
                  auVar142._4_4_ = uVar123;
                  auVar142._0_4_ = uVar123;
                  auVar142._8_4_ = uVar123;
                  auVar142._12_4_ = uVar123;
                  auVar142._16_4_ = uVar123;
                  auVar142._20_4_ = uVar123;
                  auVar142._24_4_ = uVar123;
                  auVar142._28_4_ = uVar123;
                  auVar137 = vcmpps_avx(auVar229._0_32_,auVar142,2);
                  auVar141 = vandps_avx(auVar137,local_680);
                  auVar137 = local_680 & auVar137;
                  bVar91 = (auVar137 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                  bVar92 = (auVar137 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                  bVar90 = (auVar137 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                  bVar89 = SUB321(auVar137 >> 0x7f,0) != '\0';
                  bVar88 = (auVar137 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0;
                  bVar87 = SUB321(auVar137 >> 0xbf,0) != '\0';
                  bVar86 = (auVar137 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0;
                  bVar85 = auVar137[0x1f] < '\0';
                  if (((((((bVar91 || bVar92) || bVar90) || bVar89) || bVar88) || bVar87) || bVar86)
                      || bVar85) {
                    auVar158._8_4_ = 0x7f800000;
                    auVar158._0_8_ = 0x7f8000007f800000;
                    auVar158._12_4_ = 0x7f800000;
                    auVar158._16_4_ = 0x7f800000;
                    auVar158._20_4_ = 0x7f800000;
                    auVar158._24_4_ = 0x7f800000;
                    auVar158._28_4_ = 0x7f800000;
                    auVar137 = vblendvps_avx(auVar158,auVar229._0_32_,auVar141);
                    auVar177 = vshufps_avx(auVar137,auVar137,0xb1);
                    auVar177 = vminps_avx(auVar137,auVar177);
                    auVar24 = vshufpd_avx(auVar177,auVar177,5);
                    auVar177 = vminps_avx(auVar177,auVar24);
                    auVar24 = vpermpd_avx2(auVar177,0x4e);
                    local_680 = vminps_avx(auVar177,auVar24);
                    auVar177 = vcmpps_avx(auVar137,local_680,0);
                    auVar24 = auVar141 & auVar177;
                    auVar137 = auVar141;
                    if ((((((((auVar24 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar24 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar24 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar24 >> 0x7f,0) != '\0') ||
                          (auVar24 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar24 >> 0xbf,0) != '\0') ||
                        (auVar24 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar24[0x1f] < '\0') {
                      auVar137 = vandps_avx(auVar177,auVar141);
                    }
                    uVar117 = vmovmskps_avx(auVar137);
                    uVar119 = 0;
                    for (; (uVar117 & 1) == 0; uVar117 = uVar117 >> 1 | 0x80000000) {
                      uVar119 = uVar119 + 1;
                    }
                    uVar118 = (ulong)uVar119;
                  }
                  auVar181 = ZEXT3264(local_680);
                  local_680 = auVar141;
                } while (((((((bVar91 || bVar92) || bVar90) || bVar89) || bVar88) || bVar87) ||
                         bVar86) || bVar85);
              }
            }
          }
          auVar159 = ZEXT3264(local_720);
        }
      }
      if (8 < iVar116) {
        _local_700 = auVar239._0_32_;
        local_3a0._4_4_ = iVar116;
        local_3a0._0_4_ = iVar116;
        local_3a0._8_4_ = iVar116;
        local_3a0._12_4_ = iVar116;
        local_3a0._16_4_ = iVar116;
        local_3a0._20_4_ = iVar116;
        local_3a0._24_4_ = iVar116;
        local_3a0._28_4_ = iVar116;
        local_140 = fVar161;
        fStack_13c = fVar161;
        fStack_138 = fVar161;
        fStack_134 = fVar161;
        fStack_130 = fVar161;
        fStack_12c = fVar161;
        fStack_128 = fVar161;
        fStack_124 = fVar161;
        local_160 = local_740._0_4_;
        uStack_15c = local_740._0_4_;
        uStack_158 = local_740._0_4_;
        uStack_154 = local_740._0_4_;
        uStack_150 = local_740._0_4_;
        uStack_14c = local_740._0_4_;
        uStack_148 = local_740._0_4_;
        uStack_144 = local_740._0_4_;
        local_180 = 1.0 / (float)local_540._0_4_;
        fStack_17c = local_180;
        fStack_178 = local_180;
        fStack_174 = local_180;
        fStack_170 = local_180;
        fStack_16c = local_180;
        fStack_168 = local_180;
        fStack_164 = local_180;
        local_1a0 = uVar115;
        uStack_19c = uVar115;
        uStack_198 = uVar115;
        uStack_194 = uVar115;
        uStack_190 = uVar115;
        uStack_18c = uVar115;
        uStack_188 = uVar115;
        uStack_184 = uVar115;
        local_1c0 = uVar17;
        uStack_1bc = uVar17;
        uStack_1b8 = uVar17;
        uStack_1b4 = uVar17;
        uStack_1b0 = uVar17;
        uStack_1ac = uVar17;
        uStack_1a8 = uVar17;
        uStack_1a4 = uVar17;
        lVar122 = 8;
        auVar141 = auVar232._0_32_;
        auVar128 = auVar229._0_32_;
        do {
          auVar137 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar122 * 4 + lVar25);
          auVar150 = *(undefined1 (*) [32])(lVar25 + 0x22307f0 + lVar122 * 4);
          auVar202 = *(undefined1 (*) [32])(lVar25 + 0x2230c74 + lVar122 * 4);
          pauVar5 = (undefined1 (*) [28])(lVar25 + 0x22310f8 + lVar122 * 4);
          auVar113 = *pauVar5;
          auVar240._0_4_ = auVar221._0_4_ * *(float *)*pauVar5;
          auVar240._4_4_ = auVar221._4_4_ * *(float *)(*pauVar5 + 4);
          auVar240._8_4_ = auVar221._8_4_ * *(float *)(*pauVar5 + 8);
          auVar240._12_4_ = auVar221._12_4_ * *(float *)(*pauVar5 + 0xc);
          auVar240._16_4_ = auVar221._16_4_ * *(float *)(*pauVar5 + 0x10);
          auVar240._20_4_ = auVar221._20_4_ * *(float *)(*pauVar5 + 0x14);
          auVar240._28_36_ = auVar239._28_36_;
          auVar240._24_4_ = auVar221._24_4_ * *(float *)(*pauVar5 + 0x18);
          auVar239._0_4_ = fVar242 * *(float *)*pauVar5;
          auVar239._4_4_ = fVar246 * *(float *)(*pauVar5 + 4);
          auVar239._8_4_ = fVar242 * *(float *)(*pauVar5 + 8);
          auVar239._12_4_ = fVar246 * *(float *)(*pauVar5 + 0xc);
          auVar239._16_4_ = fVar242 * *(float *)(*pauVar5 + 0x10);
          auVar239._20_4_ = fVar246 * *(float *)(*pauVar5 + 0x14);
          auVar239._28_36_ = auVar181._28_36_;
          auVar239._24_4_ = fVar242 * *(float *)(*pauVar5 + 0x18);
          auVar20 = vfmadd231ps_fma(auVar240._0_32_,auVar202,auVar170);
          auVar15 = vfmadd231ps_fma(auVar239._0_32_,auVar202,auVar196);
          auVar20 = vfmadd231ps_fma(ZEXT1632(auVar20),auVar150,auVar224._0_32_);
          auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar150,auVar159._0_32_);
          auVar20 = vfmadd231ps_fma(ZEXT1632(auVar20),auVar137,auVar216._0_32_);
          auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar137,local_6a0);
          auVar177 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar122 * 4 + lVar25);
          auVar24 = *(undefined1 (*) [32])(lVar25 + 0x2232c10 + lVar122 * 4);
          auVar228 = *(undefined1 (*) [32])(lVar25 + 0x2233094 + lVar122 * 4);
          pfVar6 = (float *)(lVar25 + 0x2233518 + lVar122 * 4);
          fVar208 = *pfVar6;
          fVar93 = pfVar6[1];
          fVar94 = pfVar6[2];
          fVar95 = pfVar6[3];
          fVar96 = pfVar6[4];
          fVar97 = pfVar6[5];
          fVar98 = pfVar6[6];
          auVar55._4_4_ = auVar221._4_4_ * fVar93;
          auVar55._0_4_ = auVar221._0_4_ * fVar208;
          auVar55._8_4_ = auVar221._8_4_ * fVar94;
          auVar55._12_4_ = auVar221._12_4_ * fVar95;
          auVar55._16_4_ = auVar221._16_4_ * fVar96;
          auVar55._20_4_ = auVar221._20_4_ * fVar97;
          auVar55._24_4_ = auVar221._24_4_ * fVar98;
          auVar55._28_4_ = local_6a0._28_4_;
          auVar222._0_4_ = fVar242 * fVar208;
          auVar222._4_4_ = fVar246 * fVar93;
          auVar222._8_4_ = fVar242 * fVar94;
          auVar222._12_4_ = fVar246 * fVar95;
          auVar222._16_4_ = fVar242 * fVar96;
          auVar222._20_4_ = fVar246 * fVar97;
          auVar222._28_36_ = auVar221._28_36_;
          auVar222._24_4_ = fVar242 * fVar98;
          auVar125 = vfmadd231ps_fma(auVar55,auVar228,auVar170);
          auVar218 = vfmadd231ps_fma(auVar222._0_32_,auVar228,auVar196);
          auVar125 = vfmadd231ps_fma(ZEXT1632(auVar125),auVar24,auVar224._0_32_);
          auVar218 = vfmadd231ps_fma(ZEXT1632(auVar218),auVar24,auVar159._0_32_);
          auVar125 = vfmadd231ps_fma(ZEXT1632(auVar125),auVar177,auVar216._0_32_);
          auVar218 = vfmadd231ps_fma(ZEXT1632(auVar218),auVar177,local_6a0);
          _local_5e0 = ZEXT1632(auVar125);
          local_380 = ZEXT1632(auVar20);
          local_6c0 = vsubps_avx(_local_5e0,local_380);
          local_5c0 = ZEXT1632(auVar218);
          auVar174 = ZEXT1632(auVar15);
          _local_600 = vsubps_avx(local_5c0,auVar174);
          auVar56._4_4_ = auVar15._4_4_ * local_6c0._4_4_;
          auVar56._0_4_ = auVar15._0_4_ * local_6c0._0_4_;
          auVar56._8_4_ = auVar15._8_4_ * local_6c0._8_4_;
          auVar56._12_4_ = auVar15._12_4_ * local_6c0._12_4_;
          auVar56._16_4_ = local_6c0._16_4_ * 0.0;
          auVar56._20_4_ = local_6c0._20_4_ * 0.0;
          auVar56._24_4_ = local_6c0._24_4_ * 0.0;
          auVar56._28_4_ = auVar177._28_4_;
          fVar161 = local_600._0_4_;
          auVar216._0_4_ = auVar20._0_4_ * fVar161;
          fVar160 = local_600._4_4_;
          auVar216._4_4_ = auVar20._4_4_ * fVar160;
          fVar203 = local_600._8_4_;
          auVar216._8_4_ = auVar20._8_4_ * fVar203;
          fVar204 = local_600._12_4_;
          auVar216._12_4_ = auVar20._12_4_ * fVar204;
          fVar205 = local_600._16_4_;
          auVar216._16_4_ = fVar205 * 0.0;
          fVar206 = local_600._20_4_;
          auVar216._20_4_ = fVar206 * 0.0;
          fVar207 = local_600._24_4_;
          auVar216._28_36_ = auVar159._28_36_;
          auVar216._24_4_ = fVar207 * 0.0;
          auVar239 = ZEXT3264(auVar202);
          auVar139 = vsubps_avx(auVar56,auVar216._0_32_);
          local_920 = auVar113._0_4_;
          fStack_91c = auVar113._4_4_;
          fStack_918 = auVar113._8_4_;
          fStack_914 = auVar113._12_4_;
          fStack_910 = auVar113._16_4_;
          fStack_90c = auVar113._20_4_;
          fStack_908 = auVar113._24_4_;
          auVar175._0_4_ = (float)local_100 * local_920;
          auVar175._4_4_ = local_100._4_4_ * fStack_91c;
          auVar175._8_4_ = (float)uStack_f8 * fStack_918;
          auVar175._12_4_ = uStack_f8._4_4_ * fStack_914;
          auVar175._16_4_ = (float)uStack_f0 * fStack_910;
          auVar175._20_4_ = uStack_f0._4_4_ * fStack_90c;
          auVar175._24_4_ = (float)uStack_e8 * fStack_908;
          auVar175._28_4_ = 0;
          auVar20 = vfmadd231ps_fma(auVar175,auVar202,local_e0);
          auVar20 = vfmadd231ps_fma(ZEXT1632(auVar20),auVar150,local_c0);
          auVar20 = vfmadd231ps_fma(ZEXT1632(auVar20),local_a0,auVar137);
          auVar181 = ZEXT1664(auVar20);
          auVar57._4_4_ = local_100._4_4_ * fVar93;
          auVar57._0_4_ = (float)local_100 * fVar208;
          auVar57._8_4_ = (float)uStack_f8 * fVar94;
          auVar57._12_4_ = uStack_f8._4_4_ * fVar95;
          auVar57._16_4_ = (float)uStack_f0 * fVar96;
          auVar57._20_4_ = uStack_f0._4_4_ * fVar97;
          auVar57._24_4_ = (float)uStack_e8 * fVar98;
          auVar57._28_4_ = uStack_e8._4_4_;
          auVar15 = vfmadd231ps_fma(auVar57,auVar228,local_e0);
          auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar24,local_c0);
          auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar177,local_a0);
          auVar58._4_4_ = fVar160 * fVar160;
          auVar58._0_4_ = fVar161 * fVar161;
          auVar58._8_4_ = fVar203 * fVar203;
          auVar58._12_4_ = fVar204 * fVar204;
          auVar58._16_4_ = fVar205 * fVar205;
          auVar58._20_4_ = fVar206 * fVar206;
          auVar58._24_4_ = fVar207 * fVar207;
          auVar58._28_4_ = local_a0._28_4_;
          auVar125 = vfmadd231ps_fma(auVar58,local_6c0,local_6c0);
          auVar153 = ZEXT1632(auVar15);
          auVar198 = vmaxps_avx(ZEXT1632(auVar20),auVar153);
          auVar226._0_4_ = auVar198._0_4_ * auVar198._0_4_ * auVar125._0_4_;
          auVar226._4_4_ = auVar198._4_4_ * auVar198._4_4_ * auVar125._4_4_;
          auVar226._8_4_ = auVar198._8_4_ * auVar198._8_4_ * auVar125._8_4_;
          auVar226._12_4_ = auVar198._12_4_ * auVar198._12_4_ * auVar125._12_4_;
          auVar226._16_4_ = auVar198._16_4_ * auVar198._16_4_ * 0.0;
          auVar226._20_4_ = auVar198._20_4_ * auVar198._20_4_ * 0.0;
          auVar226._24_4_ = auVar198._24_4_ * auVar198._24_4_ * 0.0;
          auVar226._28_4_ = 0;
          auVar59._4_4_ = auVar139._4_4_ * auVar139._4_4_;
          auVar59._0_4_ = auVar139._0_4_ * auVar139._0_4_;
          auVar59._8_4_ = auVar139._8_4_ * auVar139._8_4_;
          auVar59._12_4_ = auVar139._12_4_ * auVar139._12_4_;
          auVar59._16_4_ = auVar139._16_4_ * auVar139._16_4_;
          auVar59._20_4_ = auVar139._20_4_ * auVar139._20_4_;
          auVar59._24_4_ = auVar139._24_4_ * auVar139._24_4_;
          auVar59._28_4_ = pfVar6[7];
          auVar198 = vcmpps_avx(auVar59,auVar226,2);
          local_4c0 = (int)lVar122;
          auVar227._4_4_ = local_4c0;
          auVar227._0_4_ = local_4c0;
          auVar227._8_4_ = local_4c0;
          auVar227._12_4_ = local_4c0;
          auVar227._16_4_ = local_4c0;
          auVar227._20_4_ = local_4c0;
          auVar227._24_4_ = local_4c0;
          auVar227._28_4_ = local_4c0;
          auVar139 = vpor_avx2(auVar227,_DAT_0205a920);
          auVar23 = vpcmpgtd_avx2(local_3a0,auVar139);
          auVar139 = auVar23 & auVar198;
          if ((((((((auVar139 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar139 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar139 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar139 >> 0x7f,0) == '\0') &&
                (auVar139 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar139 >> 0xbf,0) == '\0') &&
              (auVar139 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar139[0x1f]) {
LAB_018ac846:
            auVar221 = ZEXT3264(CONCAT428(fStack_784,
                                          CONCAT424(fStack_788,
                                                    CONCAT420(fStack_78c,
                                                              CONCAT416(fStack_790,
                                                                        CONCAT412(fStack_794,
                                                                                  CONCAT48(
                                                  fStack_798,CONCAT44(fStack_79c,local_7a0))))))));
            auVar224 = ZEXT3264(local_7c0);
            auVar216 = ZEXT3264(local_780);
          }
          else {
            local_540 = vandps_avx(auVar23,auVar198);
            auVar60._4_4_ = (float)local_700._4_4_ * fVar93;
            auVar60._0_4_ = (float)local_700._0_4_ * fVar208;
            auVar60._8_4_ = fStack_6f8 * fVar94;
            auVar60._12_4_ = fStack_6f4 * fVar95;
            auVar60._16_4_ = fStack_6f0 * fVar96;
            auVar60._20_4_ = fStack_6ec * fVar97;
            auVar60._24_4_ = fStack_6e8 * fVar98;
            auVar60._28_4_ = auVar198._28_4_;
            auVar15 = vfmadd213ps_fma(auVar228,local_300,auVar60);
            auVar15 = vfmadd213ps_fma(auVar24,local_580,ZEXT1632(auVar15));
            auVar15 = vfmadd132ps_fma(auVar177,ZEXT1632(auVar15),local_5a0);
            auVar61._4_4_ = (float)local_700._4_4_ * fStack_91c;
            auVar61._0_4_ = (float)local_700._0_4_ * local_920;
            auVar61._8_4_ = fStack_6f8 * fStack_918;
            auVar61._12_4_ = fStack_6f4 * fStack_914;
            auVar61._16_4_ = fStack_6f0 * fStack_910;
            auVar61._20_4_ = fStack_6ec * fStack_90c;
            auVar61._24_4_ = fStack_6e8 * fStack_908;
            auVar61._28_4_ = auVar198._28_4_;
            auVar125 = vfmadd213ps_fma(auVar202,local_300,auVar61);
            auVar125 = vfmadd213ps_fma(auVar150,local_580,ZEXT1632(auVar125));
            auVar150 = *(undefined1 (*) [32])(lVar25 + 0x223157c + lVar122 * 4);
            auVar202 = *(undefined1 (*) [32])(lVar25 + 0x2231a00 + lVar122 * 4);
            auVar177 = *(undefined1 (*) [32])(lVar25 + 0x2231e84 + lVar122 * 4);
            pfVar6 = (float *)(lVar25 + 0x2232308 + lVar122 * 4);
            fVar161 = *pfVar6;
            fVar160 = pfVar6[1];
            fVar203 = pfVar6[2];
            fVar204 = pfVar6[3];
            fVar205 = pfVar6[4];
            fVar206 = pfVar6[5];
            fVar207 = pfVar6[6];
            auVar62._4_4_ = fStack_79c * fVar160;
            auVar62._0_4_ = local_7a0 * fVar161;
            auVar62._8_4_ = fStack_798 * fVar203;
            auVar62._12_4_ = fStack_794 * fVar204;
            auVar62._16_4_ = fStack_790 * fVar205;
            auVar62._20_4_ = fStack_78c * fVar206;
            auVar62._24_4_ = fStack_788 * fVar207;
            auVar62._28_4_ = local_600._28_4_;
            auVar237._0_4_ = fVar242 * fVar161;
            auVar237._4_4_ = fVar246 * fVar160;
            auVar237._8_4_ = fVar242 * fVar203;
            auVar237._12_4_ = fVar246 * fVar204;
            auVar237._16_4_ = fVar242 * fVar205;
            auVar237._20_4_ = fVar246 * fVar206;
            auVar237._24_4_ = fVar242 * fVar207;
            auVar237._28_4_ = 0;
            auVar63._4_4_ = fVar160 * (float)local_700._4_4_;
            auVar63._0_4_ = fVar161 * (float)local_700._0_4_;
            auVar63._8_4_ = fVar203 * fStack_6f8;
            auVar63._12_4_ = fVar204 * fStack_6f4;
            auVar63._16_4_ = fVar205 * fStack_6f0;
            auVar63._20_4_ = fVar206 * fStack_6ec;
            auVar63._24_4_ = fVar207 * fStack_6e8;
            auVar63._28_4_ = pfVar6[7];
            auVar218 = vfmadd231ps_fma(auVar62,auVar177,auVar170);
            auVar22 = vfmadd231ps_fma(auVar237,auVar177,auVar196);
            auVar190 = vfmadd231ps_fma(auVar63,local_300,auVar177);
            auVar218 = vfmadd231ps_fma(ZEXT1632(auVar218),auVar202,local_7c0);
            auVar22 = vfmadd231ps_fma(ZEXT1632(auVar22),auVar202,local_720);
            auVar190 = vfmadd231ps_fma(ZEXT1632(auVar190),local_580,auVar202);
            auVar218 = vfmadd231ps_fma(ZEXT1632(auVar218),auVar150,local_780);
            auVar22 = vfmadd231ps_fma(ZEXT1632(auVar22),auVar150,local_6a0);
            auVar190 = vfmadd231ps_fma(ZEXT1632(auVar190),local_5a0,auVar150);
            pfVar6 = (float *)(lVar25 + 0x2234728 + lVar122 * 4);
            fVar161 = *pfVar6;
            fVar160 = pfVar6[1];
            fVar203 = pfVar6[2];
            fVar204 = pfVar6[3];
            fVar205 = pfVar6[4];
            fVar206 = pfVar6[5];
            fVar207 = pfVar6[6];
            auVar64._4_4_ = fStack_79c * fVar160;
            auVar64._0_4_ = local_7a0 * fVar161;
            auVar64._8_4_ = fStack_798 * fVar203;
            auVar64._12_4_ = fStack_794 * fVar204;
            auVar64._16_4_ = fStack_790 * fVar205;
            auVar64._20_4_ = fStack_78c * fVar206;
            auVar64._24_4_ = fStack_788 * fVar207;
            auVar64._28_4_ = fStack_784;
            auVar65._4_4_ = fVar246 * fVar160;
            auVar65._0_4_ = fVar242 * fVar161;
            auVar65._8_4_ = fVar242 * fVar203;
            auVar65._12_4_ = fVar246 * fVar204;
            auVar65._16_4_ = fVar242 * fVar205;
            auVar65._20_4_ = fVar246 * fVar206;
            auVar65._24_4_ = fVar242 * fVar207;
            auVar65._28_4_ = fVar246;
            auVar66._4_4_ = fVar160 * (float)local_700._4_4_;
            auVar66._0_4_ = fVar161 * (float)local_700._0_4_;
            auVar66._8_4_ = fVar203 * fStack_6f8;
            auVar66._12_4_ = fVar204 * fStack_6f4;
            auVar66._16_4_ = fVar205 * fStack_6f0;
            auVar66._20_4_ = fVar206 * fStack_6ec;
            auVar66._24_4_ = fVar207 * fStack_6e8;
            auVar66._28_4_ = pfVar6[7];
            auVar150 = *(undefined1 (*) [32])(lVar25 + 0x22342a4 + lVar122 * 4);
            auVar209 = vfmadd231ps_fma(auVar64,auVar150,auVar170);
            auVar210 = vfmadd231ps_fma(auVar65,auVar150,auVar196);
            auVar219 = vfmadd231ps_fma(auVar66,local_300,auVar150);
            auVar150 = *(undefined1 (*) [32])(lVar25 + 0x2233e20 + lVar122 * 4);
            auVar209 = vfmadd231ps_fma(ZEXT1632(auVar209),auVar150,local_7c0);
            auVar210 = vfmadd231ps_fma(ZEXT1632(auVar210),auVar150,local_720);
            auVar219 = vfmadd231ps_fma(ZEXT1632(auVar219),local_580,auVar150);
            auVar150 = *(undefined1 (*) [32])(lVar25 + 0x223399c + lVar122 * 4);
            auVar209 = vfmadd231ps_fma(ZEXT1632(auVar209),auVar150,local_780);
            auVar210 = vfmadd231ps_fma(ZEXT1632(auVar210),auVar150,local_6a0);
            auVar219 = vfmadd231ps_fma(ZEXT1632(auVar219),local_5a0,auVar150);
            auVar150 = vandps_avx(ZEXT1632(auVar218),local_320);
            auVar202 = vandps_avx(ZEXT1632(auVar22),local_320);
            auVar202 = vmaxps_avx(auVar150,auVar202);
            auVar150 = vandps_avx(ZEXT1632(auVar190),local_320);
            auVar150 = vmaxps_avx(auVar202,auVar150);
            auVar112._4_4_ = fStack_13c;
            auVar112._0_4_ = local_140;
            auVar112._8_4_ = fStack_138;
            auVar112._12_4_ = fStack_134;
            auVar112._16_4_ = fStack_130;
            auVar112._20_4_ = fStack_12c;
            auVar112._24_4_ = fStack_128;
            auVar112._28_4_ = fStack_124;
            auVar150 = vcmpps_avx(auVar150,auVar112,1);
            auVar177 = vblendvps_avx(ZEXT1632(auVar218),local_6c0,auVar150);
            auVar24 = vblendvps_avx(ZEXT1632(auVar22),_local_600,auVar150);
            auVar150 = vandps_avx(ZEXT1632(auVar209),local_320);
            auVar202 = vandps_avx(ZEXT1632(auVar210),local_320);
            auVar202 = vmaxps_avx(auVar150,auVar202);
            auVar150 = vandps_avx(local_320,ZEXT1632(auVar219));
            auVar150 = vmaxps_avx(auVar202,auVar150);
            auVar202 = vcmpps_avx(auVar150,auVar112,1);
            auVar150 = vblendvps_avx(ZEXT1632(auVar209),local_6c0,auVar202);
            auVar202 = vblendvps_avx(ZEXT1632(auVar210),_local_600,auVar202);
            auVar125 = vfmadd213ps_fma(auVar137,local_5a0,ZEXT1632(auVar125));
            auVar218 = vfmadd213ps_fma(auVar177,auVar177,ZEXT832(0) << 0x20);
            auVar218 = vfmadd231ps_fma(ZEXT1632(auVar218),auVar24,auVar24);
            auVar137 = vrsqrtps_avx(ZEXT1632(auVar218));
            fVar161 = auVar137._0_4_;
            fVar160 = auVar137._4_4_;
            fVar203 = auVar137._8_4_;
            fVar204 = auVar137._12_4_;
            fVar205 = auVar137._16_4_;
            fVar206 = auVar137._20_4_;
            fVar207 = auVar137._24_4_;
            auVar67._4_4_ = fVar160 * fVar160 * fVar160 * auVar218._4_4_ * -0.5;
            auVar67._0_4_ = fVar161 * fVar161 * fVar161 * auVar218._0_4_ * -0.5;
            auVar67._8_4_ = fVar203 * fVar203 * fVar203 * auVar218._8_4_ * -0.5;
            auVar67._12_4_ = fVar204 * fVar204 * fVar204 * auVar218._12_4_ * -0.5;
            auVar67._16_4_ = fVar205 * fVar205 * fVar205 * -0.0;
            auVar67._20_4_ = fVar206 * fVar206 * fVar206 * -0.0;
            auVar67._24_4_ = fVar207 * fVar207 * fVar207 * -0.0;
            auVar67._28_4_ = 0;
            auVar245._8_4_ = 0x3fc00000;
            auVar245._0_8_ = 0x3fc000003fc00000;
            auVar245._12_4_ = 0x3fc00000;
            auVar245._16_4_ = 0x3fc00000;
            auVar245._20_4_ = 0x3fc00000;
            auVar245._24_4_ = 0x3fc00000;
            auVar245._28_4_ = 0x3fc00000;
            auVar218 = vfmadd231ps_fma(auVar67,auVar245,auVar137);
            fVar161 = auVar218._0_4_;
            fVar160 = auVar218._4_4_;
            auVar68._4_4_ = auVar24._4_4_ * fVar160;
            auVar68._0_4_ = auVar24._0_4_ * fVar161;
            fVar203 = auVar218._8_4_;
            auVar68._8_4_ = auVar24._8_4_ * fVar203;
            fVar204 = auVar218._12_4_;
            auVar68._12_4_ = auVar24._12_4_ * fVar204;
            auVar68._16_4_ = auVar24._16_4_ * 0.0;
            auVar68._20_4_ = auVar24._20_4_ * 0.0;
            auVar68._24_4_ = auVar24._24_4_ * 0.0;
            auVar68._28_4_ = auVar24._28_4_;
            auVar69._4_4_ = fVar160 * -auVar177._4_4_;
            auVar69._0_4_ = fVar161 * -auVar177._0_4_;
            auVar69._8_4_ = fVar203 * -auVar177._8_4_;
            auVar69._12_4_ = fVar204 * -auVar177._12_4_;
            auVar69._16_4_ = -auVar177._16_4_ * 0.0;
            auVar69._20_4_ = -auVar177._20_4_ * 0.0;
            auVar69._24_4_ = -auVar177._24_4_ * 0.0;
            auVar69._28_4_ = auVar137._28_4_;
            auVar218 = vfmadd213ps_fma(auVar150,auVar150,ZEXT832(0) << 0x20);
            auVar218 = vfmadd231ps_fma(ZEXT1632(auVar218),auVar202,auVar202);
            auVar137 = vrsqrtps_avx(ZEXT1632(auVar218));
            auVar70._28_4_ = local_5a0._28_4_;
            auVar70._0_28_ =
                 ZEXT1628(CONCAT412(fVar204 * 0.0,
                                    CONCAT48(fVar203 * 0.0,CONCAT44(fVar160 * 0.0,fVar161 * 0.0))));
            fVar161 = auVar137._0_4_;
            fVar160 = auVar137._4_4_;
            fVar203 = auVar137._8_4_;
            fVar204 = auVar137._12_4_;
            fVar205 = auVar137._16_4_;
            fVar206 = auVar137._20_4_;
            fVar207 = auVar137._24_4_;
            auVar71._4_4_ = fVar160 * fVar160 * fVar160 * auVar218._4_4_ * -0.5;
            auVar71._0_4_ = fVar161 * fVar161 * fVar161 * auVar218._0_4_ * -0.5;
            auVar71._8_4_ = fVar203 * fVar203 * fVar203 * auVar218._8_4_ * -0.5;
            auVar71._12_4_ = fVar204 * fVar204 * fVar204 * auVar218._12_4_ * -0.5;
            auVar71._16_4_ = fVar205 * fVar205 * fVar205 * -0.0;
            auVar71._20_4_ = fVar206 * fVar206 * fVar206 * -0.0;
            auVar71._24_4_ = fVar207 * fVar207 * fVar207 * -0.0;
            auVar71._28_4_ = 0;
            auVar218 = vfmadd231ps_fma(auVar71,auVar245,auVar137);
            fVar161 = auVar218._0_4_;
            fVar160 = auVar218._4_4_;
            auVar72._4_4_ = auVar202._4_4_ * fVar160;
            auVar72._0_4_ = auVar202._0_4_ * fVar161;
            fVar203 = auVar218._8_4_;
            auVar72._8_4_ = auVar202._8_4_ * fVar203;
            fVar204 = auVar218._12_4_;
            auVar72._12_4_ = auVar202._12_4_ * fVar204;
            auVar72._16_4_ = auVar202._16_4_ * 0.0;
            auVar72._20_4_ = auVar202._20_4_ * 0.0;
            auVar72._24_4_ = auVar202._24_4_ * 0.0;
            auVar72._28_4_ = 0;
            auVar73._4_4_ = fVar160 * -auVar150._4_4_;
            auVar73._0_4_ = fVar161 * -auVar150._0_4_;
            auVar73._8_4_ = fVar203 * -auVar150._8_4_;
            auVar73._12_4_ = fVar204 * -auVar150._12_4_;
            auVar73._16_4_ = -auVar150._16_4_ * 0.0;
            auVar73._20_4_ = -auVar150._20_4_ * 0.0;
            auVar73._24_4_ = -auVar150._24_4_ * 0.0;
            auVar73._28_4_ = auVar137._28_4_;
            auVar74._28_4_ = 0xbf000000;
            auVar74._0_28_ =
                 ZEXT1628(CONCAT412(fVar204 * 0.0,
                                    CONCAT48(fVar203 * 0.0,CONCAT44(fVar160 * 0.0,fVar161 * 0.0))));
            auVar218 = vfmadd213ps_fma(auVar68,ZEXT1632(auVar20),local_380);
            auVar137 = ZEXT1632(auVar20);
            auVar22 = vfmadd213ps_fma(auVar69,auVar137,auVar174);
            auVar190 = vfmadd213ps_fma(auVar70,auVar137,ZEXT1632(auVar125));
            auVar220 = vfnmadd213ps_fma(auVar68,auVar137,local_380);
            auVar209 = vfmadd213ps_fma(auVar72,auVar153,_local_5e0);
            auVar26 = vfnmadd213ps_fma(auVar69,auVar137,auVar174);
            auVar210 = vfmadd213ps_fma(auVar73,auVar153,local_5c0);
            auVar176 = ZEXT1632(auVar20);
            auVar234 = vfnmadd231ps_fma(ZEXT1632(auVar125),auVar176,auVar70);
            auVar125 = vfmadd213ps_fma(auVar74,auVar153,ZEXT1632(auVar15));
            auVar27 = vfnmadd213ps_fma(auVar72,auVar153,_local_5e0);
            auVar230 = vfnmadd213ps_fma(auVar73,auVar153,local_5c0);
            auVar236 = vfnmadd231ps_fma(ZEXT1632(auVar15),auVar153,auVar74);
            auVar137 = vsubps_avx(ZEXT1632(auVar210),ZEXT1632(auVar26));
            auVar150 = vsubps_avx(ZEXT1632(auVar125),ZEXT1632(auVar234));
            auVar75._4_4_ = auVar137._4_4_ * auVar234._4_4_;
            auVar75._0_4_ = auVar137._0_4_ * auVar234._0_4_;
            auVar75._8_4_ = auVar137._8_4_ * auVar234._8_4_;
            auVar75._12_4_ = auVar137._12_4_ * auVar234._12_4_;
            auVar75._16_4_ = auVar137._16_4_ * 0.0;
            auVar75._20_4_ = auVar137._20_4_ * 0.0;
            auVar75._24_4_ = auVar137._24_4_ * 0.0;
            auVar75._28_4_ = 0;
            auVar219 = vfmsub231ps_fma(auVar75,ZEXT1632(auVar26),auVar150);
            auVar76._4_4_ = auVar220._4_4_ * auVar150._4_4_;
            auVar76._0_4_ = auVar220._0_4_ * auVar150._0_4_;
            auVar76._8_4_ = auVar220._8_4_ * auVar150._8_4_;
            auVar76._12_4_ = auVar220._12_4_ * auVar150._12_4_;
            auVar76._16_4_ = auVar150._16_4_ * 0.0;
            auVar76._20_4_ = auVar150._20_4_ * 0.0;
            auVar76._24_4_ = auVar150._24_4_ * 0.0;
            auVar76._28_4_ = auVar150._28_4_;
            auVar228 = ZEXT1632(auVar220);
            auVar150 = vsubps_avx(ZEXT1632(auVar209),auVar228);
            auVar139 = ZEXT1632(auVar234);
            auVar15 = vfmsub231ps_fma(auVar76,auVar139,auVar150);
            auVar77._4_4_ = auVar26._4_4_ * auVar150._4_4_;
            auVar77._0_4_ = auVar26._0_4_ * auVar150._0_4_;
            auVar77._8_4_ = auVar26._8_4_ * auVar150._8_4_;
            auVar77._12_4_ = auVar26._12_4_ * auVar150._12_4_;
            auVar77._16_4_ = auVar150._16_4_ * 0.0;
            auVar77._20_4_ = auVar150._20_4_ * 0.0;
            auVar77._24_4_ = auVar150._24_4_ * 0.0;
            auVar77._28_4_ = auVar150._28_4_;
            auVar220 = vfmsub231ps_fma(auVar77,auVar228,auVar137);
            auVar15 = vfmadd231ps_fma(ZEXT1632(auVar220),ZEXT832(0) << 0x20,ZEXT1632(auVar15));
            auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),ZEXT832(0) << 0x20,ZEXT1632(auVar219));
            auVar23 = vcmpps_avx(ZEXT1632(auVar15),ZEXT832(0) << 0x20,2);
            auVar137 = vblendvps_avx(ZEXT1632(auVar27),ZEXT1632(auVar218),auVar23);
            auVar150 = vblendvps_avx(ZEXT1632(auVar230),ZEXT1632(auVar22),auVar23);
            local_740 = vblendvps_avx(ZEXT1632(auVar236),ZEXT1632(auVar190),auVar23);
            auVar202 = vblendvps_avx(auVar228,ZEXT1632(auVar209),auVar23);
            auVar177 = vblendvps_avx(ZEXT1632(auVar26),ZEXT1632(auVar210),auVar23);
            auVar24 = vblendvps_avx(auVar139,ZEXT1632(auVar125),auVar23);
            auVar228 = vblendvps_avx(ZEXT1632(auVar209),auVar228,auVar23);
            auVar198 = vblendvps_avx(ZEXT1632(auVar210),ZEXT1632(auVar26),auVar23);
            auVar15 = vpackssdw_avx(local_540._0_16_,local_540._16_16_);
            auVar139 = vblendvps_avx(ZEXT1632(auVar125),auVar139,auVar23);
            auVar228 = vsubps_avx(auVar228,auVar137);
            auVar198 = vsubps_avx(auVar198,auVar150);
            auVar174 = vsubps_avx(auVar139,local_740);
            auVar239 = ZEXT3264(auVar174);
            auVar130 = vsubps_avx(auVar137,auVar202);
            auVar145 = vsubps_avx(auVar150,auVar177);
            auVar171 = vsubps_avx(local_740,auVar24);
            auVar199._0_4_ = auVar174._0_4_ * auVar137._0_4_;
            auVar199._4_4_ = auVar174._4_4_ * auVar137._4_4_;
            auVar199._8_4_ = auVar174._8_4_ * auVar137._8_4_;
            auVar199._12_4_ = auVar174._12_4_ * auVar137._12_4_;
            auVar199._16_4_ = auVar174._16_4_ * auVar137._16_4_;
            auVar199._20_4_ = auVar174._20_4_ * auVar137._20_4_;
            auVar199._24_4_ = auVar174._24_4_ * auVar137._24_4_;
            auVar199._28_4_ = 0;
            auVar125 = vfmsub231ps_fma(auVar199,local_740,auVar228);
            auVar78._4_4_ = auVar228._4_4_ * auVar150._4_4_;
            auVar78._0_4_ = auVar228._0_4_ * auVar150._0_4_;
            auVar78._8_4_ = auVar228._8_4_ * auVar150._8_4_;
            auVar78._12_4_ = auVar228._12_4_ * auVar150._12_4_;
            auVar78._16_4_ = auVar228._16_4_ * auVar150._16_4_;
            auVar78._20_4_ = auVar228._20_4_ * auVar150._20_4_;
            auVar78._24_4_ = auVar228._24_4_ * auVar150._24_4_;
            auVar78._28_4_ = auVar139._28_4_;
            auVar218 = vfmsub231ps_fma(auVar78,auVar137,auVar198);
            auVar125 = vfmadd231ps_fma(ZEXT1632(auVar218),ZEXT1632(auVar125),_DAT_02020f00);
            auVar200._0_4_ = auVar198._0_4_ * local_740._0_4_;
            auVar200._4_4_ = auVar198._4_4_ * local_740._4_4_;
            auVar200._8_4_ = auVar198._8_4_ * local_740._8_4_;
            auVar200._12_4_ = auVar198._12_4_ * local_740._12_4_;
            auVar200._16_4_ = auVar198._16_4_ * local_740._16_4_;
            auVar200._20_4_ = auVar198._20_4_ * local_740._20_4_;
            auVar200._24_4_ = auVar198._24_4_ * local_740._24_4_;
            auVar200._28_4_ = 0;
            auVar218 = vfmsub231ps_fma(auVar200,auVar150,auVar174);
            auVar218 = vfmadd231ps_fma(ZEXT1632(auVar125),ZEXT832(0) << 0x20,ZEXT1632(auVar218));
            auVar181 = ZEXT1664(auVar218);
            auVar201._0_4_ = auVar171._0_4_ * auVar202._0_4_;
            auVar201._4_4_ = auVar171._4_4_ * auVar202._4_4_;
            auVar201._8_4_ = auVar171._8_4_ * auVar202._8_4_;
            auVar201._12_4_ = auVar171._12_4_ * auVar202._12_4_;
            auVar201._16_4_ = auVar171._16_4_ * auVar202._16_4_;
            auVar201._20_4_ = auVar171._20_4_ * auVar202._20_4_;
            auVar201._24_4_ = auVar171._24_4_ * auVar202._24_4_;
            auVar201._28_4_ = 0;
            auVar125 = vfmsub231ps_fma(auVar201,auVar130,auVar24);
            auVar79._4_4_ = auVar145._4_4_ * auVar24._4_4_;
            auVar79._0_4_ = auVar145._0_4_ * auVar24._0_4_;
            auVar79._8_4_ = auVar145._8_4_ * auVar24._8_4_;
            auVar79._12_4_ = auVar145._12_4_ * auVar24._12_4_;
            auVar79._16_4_ = auVar145._16_4_ * auVar24._16_4_;
            auVar79._20_4_ = auVar145._20_4_ * auVar24._20_4_;
            auVar79._24_4_ = auVar145._24_4_ * auVar24._24_4_;
            auVar79._28_4_ = auVar24._28_4_;
            auVar22 = vfmsub231ps_fma(auVar79,auVar177,auVar171);
            auVar80._4_4_ = auVar130._4_4_ * auVar177._4_4_;
            auVar80._0_4_ = auVar130._0_4_ * auVar177._0_4_;
            auVar80._8_4_ = auVar130._8_4_ * auVar177._8_4_;
            auVar80._12_4_ = auVar130._12_4_ * auVar177._12_4_;
            auVar80._16_4_ = auVar130._16_4_ * auVar177._16_4_;
            auVar80._20_4_ = auVar130._20_4_ * auVar177._20_4_;
            auVar80._24_4_ = auVar130._24_4_ * auVar177._24_4_;
            auVar80._28_4_ = auVar177._28_4_;
            auVar190 = vfmsub231ps_fma(auVar80,auVar145,auVar202);
            auVar125 = vfmadd231ps_fma(ZEXT1632(auVar190),ZEXT832(0) << 0x20,ZEXT1632(auVar125));
            auVar22 = vfmadd231ps_fma(ZEXT1632(auVar125),ZEXT832(0) << 0x20,ZEXT1632(auVar22));
            auVar202 = vmaxps_avx(ZEXT1632(auVar218),ZEXT1632(auVar22));
            auVar202 = vcmpps_avx(auVar202,ZEXT832(0) << 0x20,2);
            auVar125 = vpackssdw_avx(auVar202._0_16_,auVar202._16_16_);
            auVar15 = vpand_avx(auVar125,auVar15);
            auVar202 = vpmovsxwd_avx2(auVar15);
            if ((((((((auVar202 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar202 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar202 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar202 >> 0x7f,0) == '\0') &&
                  (auVar202 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar202 >> 0xbf,0) == '\0') &&
                (auVar202 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar202[0x1f]) {
LAB_018acbb6:
              auVar229 = ZEXT3264(CONCAT824(uStack_608,
                                            CONCAT816(uStack_610,CONCAT88(uStack_618,local_620))));
            }
            else {
              auVar81._4_4_ = auVar198._4_4_ * auVar171._4_4_;
              auVar81._0_4_ = auVar198._0_4_ * auVar171._0_4_;
              auVar81._8_4_ = auVar198._8_4_ * auVar171._8_4_;
              auVar81._12_4_ = auVar198._12_4_ * auVar171._12_4_;
              auVar81._16_4_ = auVar198._16_4_ * auVar171._16_4_;
              auVar81._20_4_ = auVar198._20_4_ * auVar171._20_4_;
              auVar81._24_4_ = auVar198._24_4_ * auVar171._24_4_;
              auVar81._28_4_ = auVar202._28_4_;
              auVar210 = vfmsub231ps_fma(auVar81,auVar145,auVar174);
              auVar215._0_4_ = auVar174._0_4_ * auVar130._0_4_;
              auVar215._4_4_ = auVar174._4_4_ * auVar130._4_4_;
              auVar215._8_4_ = auVar174._8_4_ * auVar130._8_4_;
              auVar215._12_4_ = auVar174._12_4_ * auVar130._12_4_;
              auVar215._16_4_ = auVar174._16_4_ * auVar130._16_4_;
              auVar215._20_4_ = auVar174._20_4_ * auVar130._20_4_;
              auVar215._24_4_ = auVar174._24_4_ * auVar130._24_4_;
              auVar215._28_4_ = 0;
              auVar209 = vfmsub231ps_fma(auVar215,auVar228,auVar171);
              auVar82._4_4_ = auVar228._4_4_ * auVar145._4_4_;
              auVar82._0_4_ = auVar228._0_4_ * auVar145._0_4_;
              auVar82._8_4_ = auVar228._8_4_ * auVar145._8_4_;
              auVar82._12_4_ = auVar228._12_4_ * auVar145._12_4_;
              auVar82._16_4_ = auVar228._16_4_ * auVar145._16_4_;
              auVar82._20_4_ = auVar228._20_4_ * auVar145._20_4_;
              auVar82._24_4_ = auVar228._24_4_ * auVar145._24_4_;
              auVar82._28_4_ = auVar145._28_4_;
              auVar219 = vfmsub231ps_fma(auVar82,auVar130,auVar198);
              auVar125 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar209),ZEXT1632(auVar219));
              auVar190 = vfmadd231ps_fma(ZEXT1632(auVar125),ZEXT1632(auVar210),ZEXT832(0) << 0x20);
              auVar202 = vrcpps_avx(ZEXT1632(auVar190));
              auVar238._8_4_ = 0x3f800000;
              auVar238._0_8_ = &DAT_3f8000003f800000;
              auVar238._12_4_ = 0x3f800000;
              auVar238._16_4_ = 0x3f800000;
              auVar238._20_4_ = 0x3f800000;
              auVar238._24_4_ = 0x3f800000;
              auVar238._28_4_ = 0x3f800000;
              auVar239 = ZEXT3264(auVar238);
              auVar125 = vfnmadd213ps_fma(auVar202,ZEXT1632(auVar190),auVar238);
              auVar125 = vfmadd132ps_fma(ZEXT1632(auVar125),auVar202,auVar202);
              auVar187._0_4_ = auVar219._0_4_ * local_740._0_4_;
              auVar187._4_4_ = auVar219._4_4_ * local_740._4_4_;
              auVar187._8_4_ = auVar219._8_4_ * local_740._8_4_;
              auVar187._12_4_ = auVar219._12_4_ * local_740._12_4_;
              auVar187._16_4_ = local_740._16_4_ * 0.0;
              auVar187._20_4_ = local_740._20_4_ * 0.0;
              auVar187._24_4_ = local_740._24_4_ * 0.0;
              auVar187._28_4_ = 0;
              auVar209 = vfmadd231ps_fma(auVar187,ZEXT1632(auVar209),auVar150);
              auVar209 = vfmadd231ps_fma(ZEXT1632(auVar209),auVar137,ZEXT1632(auVar210));
              fVar161 = auVar125._0_4_;
              fVar160 = auVar125._4_4_;
              fVar203 = auVar125._8_4_;
              fVar204 = auVar125._12_4_;
              auVar202 = ZEXT1632(CONCAT412(fVar204 * auVar209._12_4_,
                                            CONCAT48(fVar203 * auVar209._8_4_,
                                                     CONCAT44(fVar160 * auVar209._4_4_,
                                                              fVar161 * auVar209._0_4_))));
              uVar123 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar188._4_4_ = uVar123;
              auVar188._0_4_ = uVar123;
              auVar188._8_4_ = uVar123;
              auVar188._12_4_ = uVar123;
              auVar188._16_4_ = uVar123;
              auVar188._20_4_ = uVar123;
              auVar188._24_4_ = uVar123;
              auVar188._28_4_ = uVar123;
              auVar111._4_4_ = uStack_15c;
              auVar111._0_4_ = local_160;
              auVar111._8_4_ = uStack_158;
              auVar111._12_4_ = uStack_154;
              auVar111._16_4_ = uStack_150;
              auVar111._20_4_ = uStack_14c;
              auVar111._24_4_ = uStack_148;
              auVar111._28_4_ = uStack_144;
              auVar137 = vcmpps_avx(auVar111,auVar202,2);
              auVar150 = vcmpps_avx(auVar202,auVar188,2);
              auVar137 = vandps_avx(auVar150,auVar137);
              auVar125 = vpackssdw_avx(auVar137._0_16_,auVar137._16_16_);
              auVar15 = vpand_avx(auVar15,auVar125);
              auVar137 = vpmovsxwd_avx2(auVar15);
              if ((((((((auVar137 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar137 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar137 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar137 >> 0x7f,0) == '\0') &&
                    (auVar137 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar137 >> 0xbf,0) == '\0') &&
                  (auVar137 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar137[0x1f]) goto LAB_018acbb6;
              auVar137 = vcmpps_avx(ZEXT1632(auVar190),ZEXT832(0) << 0x20,4);
              auVar125 = vpackssdw_avx(auVar137._0_16_,auVar137._16_16_);
              auVar15 = vpand_avx(auVar15,auVar125);
              auVar137 = vpmovsxwd_avx2(auVar15);
              auVar229 = ZEXT3264(CONCAT824(uStack_608,
                                            CONCAT816(uStack_610,CONCAT88(uStack_618,local_620))));
              if ((((((((auVar137 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar137 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar137 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar137 >> 0x7f,0) != '\0') ||
                    (auVar137 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar137 >> 0xbf,0) != '\0') ||
                  (auVar137 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar137[0x1f] < '\0') {
                auVar177 = ZEXT1632(CONCAT412(fVar204 * auVar218._12_4_,
                                              CONCAT48(fVar203 * auVar218._8_4_,
                                                       CONCAT44(fVar160 * auVar218._4_4_,
                                                                fVar161 * auVar218._0_4_))));
                auVar83._28_4_ = SUB84(uStack_608,4);
                auVar83._0_28_ =
                     ZEXT1628(CONCAT412(fVar204 * auVar22._12_4_,
                                        CONCAT48(fVar203 * auVar22._8_4_,
                                                 CONCAT44(fVar160 * auVar22._4_4_,
                                                          fVar161 * auVar22._0_4_))));
                auVar223._8_4_ = 0x3f800000;
                auVar223._0_8_ = &DAT_3f8000003f800000;
                auVar223._12_4_ = 0x3f800000;
                auVar223._16_4_ = 0x3f800000;
                auVar223._20_4_ = 0x3f800000;
                auVar223._24_4_ = 0x3f800000;
                auVar223._28_4_ = 0x3f800000;
                auVar150 = vsubps_avx(auVar223,auVar177);
                local_120 = vblendvps_avx(auVar150,auVar177,auVar23);
                auVar150 = vsubps_avx(auVar223,auVar83);
                local_3e0 = vblendvps_avx(auVar150,auVar83,auVar23);
                auVar181 = ZEXT3264(local_3e0);
                auVar229 = ZEXT3264(auVar137);
                local_560 = auVar202;
              }
            }
            auVar232 = ZEXT3264(auVar141);
            auVar137 = auVar229._0_32_;
            if ((((((((auVar137 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar137 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar137 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar137 >> 0x7f,0) == '\0') &&
                  (auVar229 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
                 SUB321(auVar137 >> 0xbf,0) == '\0') &&
                (auVar229 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
                -1 < auVar229[0x1f]) goto LAB_018ac846;
            auVar150 = vsubps_avx(auVar153,auVar176);
            auVar15 = vfmadd213ps_fma(auVar150,local_120,auVar176);
            fVar161 = *(float *)((long)pre->ray_space + k * 4 + -0x20);
            auVar84._4_4_ = (auVar15._4_4_ + auVar15._4_4_) * fVar161;
            auVar84._0_4_ = (auVar15._0_4_ + auVar15._0_4_) * fVar161;
            auVar84._8_4_ = (auVar15._8_4_ + auVar15._8_4_) * fVar161;
            auVar84._12_4_ = (auVar15._12_4_ + auVar15._12_4_) * fVar161;
            auVar84._16_4_ = fVar161 * 0.0;
            auVar84._20_4_ = fVar161 * 0.0;
            auVar84._24_4_ = fVar161 * 0.0;
            auVar84._28_4_ = fVar161;
            auVar150 = vcmpps_avx(local_560,auVar84,6);
            auVar202 = auVar137 & auVar150;
            auVar221 = ZEXT3264(CONCAT428(fStack_784,
                                          CONCAT424(fStack_788,
                                                    CONCAT420(fStack_78c,
                                                              CONCAT416(fStack_790,
                                                                        CONCAT412(fStack_794,
                                                                                  CONCAT48(
                                                  fStack_798,CONCAT44(fStack_79c,local_7a0))))))));
            auVar224 = ZEXT3264(local_7c0);
            auVar216 = ZEXT3264(local_780);
            if ((((((((auVar202 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar202 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar202 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar202 >> 0x7f,0) != '\0') ||
                  (auVar202 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar202 >> 0xbf,0) != '\0') ||
                (auVar202 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar202[0x1f] < '\0') {
              local_460 = vandps_avx(auVar150,auVar137);
              auVar154._8_4_ = 0xbf800000;
              auVar154._0_8_ = 0xbf800000bf800000;
              auVar154._12_4_ = 0xbf800000;
              auVar154._16_4_ = 0xbf800000;
              auVar154._20_4_ = 0xbf800000;
              auVar154._24_4_ = 0xbf800000;
              auVar154._28_4_ = 0xbf800000;
              auVar178._8_4_ = 0x40000000;
              auVar178._0_8_ = 0x4000000040000000;
              auVar178._12_4_ = 0x40000000;
              auVar178._16_4_ = 0x40000000;
              auVar178._20_4_ = 0x40000000;
              auVar178._24_4_ = 0x40000000;
              auVar178._28_4_ = 0x40000000;
              auVar181 = ZEXT3264(auVar178);
              auVar15 = vfmadd213ps_fma(local_3e0,auVar178,auVar154);
              local_520 = local_120;
              local_500 = ZEXT1632(auVar15);
              local_3e0 = local_500;
              auVar137 = local_3e0;
              local_4e0 = local_560;
              pGVar18 = (context->scene->geometries).items[uVar115].ptr;
              if ((pGVar18->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                fVar161 = (float)local_4c0;
                local_440[0] = (fVar161 + local_120._0_4_ + 0.0) * local_180;
                local_440[1] = (fVar161 + local_120._4_4_ + 1.0) * fStack_17c;
                local_440[2] = (fVar161 + local_120._8_4_ + 2.0) * fStack_178;
                local_440[3] = (fVar161 + local_120._12_4_ + 3.0) * fStack_174;
                fStack_430 = (fVar161 + local_120._16_4_ + 4.0) * fStack_170;
                fStack_42c = (fVar161 + local_120._20_4_ + 5.0) * fStack_16c;
                fStack_428 = (fVar161 + local_120._24_4_ + 6.0) * fStack_168;
                fStack_424 = fVar161 + local_120._28_4_ + 7.0;
                local_3e0._0_8_ = auVar15._0_8_;
                local_3e0._8_8_ = auVar15._8_8_;
                local_420 = local_3e0._0_8_;
                uStack_418 = local_3e0._8_8_;
                uStack_410 = 0;
                uStack_408 = 0;
                local_400 = local_560;
                auVar155._8_4_ = 0x7f800000;
                auVar155._0_8_ = 0x7f8000007f800000;
                auVar155._12_4_ = 0x7f800000;
                auVar155._16_4_ = 0x7f800000;
                auVar155._20_4_ = 0x7f800000;
                auVar155._24_4_ = 0x7f800000;
                auVar155._28_4_ = 0x7f800000;
                auVar150 = vblendvps_avx(auVar155,local_560,local_460);
                auVar202 = vshufps_avx(auVar150,auVar150,0xb1);
                auVar202 = vminps_avx(auVar150,auVar202);
                auVar177 = vshufpd_avx(auVar202,auVar202,5);
                auVar202 = vminps_avx(auVar202,auVar177);
                auVar177 = vpermpd_avx2(auVar202,0x4e);
                auVar202 = vminps_avx(auVar202,auVar177);
                auVar202 = vcmpps_avx(auVar150,auVar202,0);
                auVar177 = local_460 & auVar202;
                auVar150 = local_460;
                if ((((((((auVar177 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar177 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar177 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar177 >> 0x7f,0) != '\0') ||
                      (auVar177 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar177 >> 0xbf,0) != '\0') ||
                    (auVar177 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar177[0x1f] < '\0') {
                  auVar150 = vandps_avx(auVar202,local_460);
                }
                uVar117 = vmovmskps_avx(auVar150);
                uVar119 = 0;
                for (; (uVar117 & 1) == 0; uVar117 = uVar117 >> 1 | 0x80000000) {
                  uVar119 = uVar119 + 1;
                }
                uVar118 = (ulong)uVar119;
                local_3e0 = auVar137;
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar18->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  fVar161 = local_440[uVar118];
                  fVar160 = 1.0 - fVar161;
                  auVar125 = ZEXT416((uint)fVar161);
                  auVar20 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar125,
                                            ZEXT416(0xc0a00000));
                  auVar15 = vfmadd231ss_fma(ZEXT416((uint)(fVar161 * fVar161 * 3.0)),
                                            ZEXT416((uint)(fVar161 + fVar161)),auVar20);
                  auVar20 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar125,
                                            ZEXT416(0x40000000));
                  auVar20 = vfmadd231ss_fma(ZEXT416((uint)(fVar160 * fVar160 * -3.0)),
                                            ZEXT416((uint)(fVar160 + fVar160)),auVar20);
                  auVar218 = vfnmadd231ss_fma(ZEXT416((uint)(fVar161 * (fVar160 + fVar160))),
                                              ZEXT416((uint)fVar160),ZEXT416((uint)fVar160));
                  auVar125 = vfmadd231ss_fma(ZEXT416((uint)(fVar161 * fVar161)),auVar125,
                                             ZEXT416((uint)(fVar160 * -2.0)));
                  fVar160 = auVar20._0_4_ * 0.5;
                  fVar203 = auVar125._0_4_ * 0.5;
                  auVar184._0_4_ = fVar203 * local_820;
                  auVar184._4_4_ = fVar203 * fStack_81c;
                  auVar184._8_4_ = fVar203 * fStack_818;
                  auVar184._12_4_ = fVar203 * fStack_814;
                  auVar144._4_4_ = fVar160;
                  auVar144._0_4_ = fVar160;
                  auVar144._8_4_ = fVar160;
                  auVar144._12_4_ = fVar160;
                  auVar20 = vfmadd132ps_fma(auVar144,auVar184,auVar21);
                  fVar160 = auVar15._0_4_ * 0.5;
                  auVar185._4_4_ = fVar160;
                  auVar185._0_4_ = fVar160;
                  auVar185._8_4_ = fVar160;
                  auVar185._12_4_ = fVar160;
                  auVar20 = vfmadd132ps_fma(auVar185,auVar20,auVar9);
                  uVar123 = *(undefined4 *)((long)&local_420 + uVar118 * 4);
                  fVar160 = auVar218._0_4_ * 0.5;
                  auVar163._4_4_ = fVar160;
                  auVar163._0_4_ = fVar160;
                  auVar163._8_4_ = fVar160;
                  auVar163._12_4_ = fVar160;
                  auVar20 = vfmadd132ps_fma(auVar163,auVar20,auVar10);
                  auVar181 = ZEXT1664(auVar20);
                  *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_400 + uVar118 * 4);
                  *(int *)(ray + k * 4 + 0x180) = auVar20._0_4_;
                  uVar233 = vextractps_avx(auVar20,1);
                  *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar233;
                  uVar233 = vextractps_avx(auVar20,2);
                  *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar233;
                  *(float *)(ray + k * 4 + 0x1e0) = fVar161;
                  *(undefined4 *)(ray + k * 4 + 0x200) = uVar123;
                  *(uint *)(ray + k * 4 + 0x220) = uVar17;
                  *(uint *)(ray + k * 4 + 0x240) = uVar115;
                  *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                }
                else {
                  local_960 = ZEXT1632(CONCAT88(auVar20._8_8_,uVar118));
                  local_740._0_16_ = auVar12;
                  _local_6e0 = ZEXT1632(auVar13);
                  local_680 = local_460;
                  local_4bc = iVar116;
                  local_4b0 = uVar217;
                  uStack_4a8 = uVar100;
                  local_4a0 = uVar101;
                  uStack_498 = uVar102;
                  local_490 = uVar103;
                  uStack_488 = uVar104;
                  local_480 = uVar105;
                  uStack_478 = uVar106;
                  do {
                    auVar150 = local_960;
                    uVar119 = *(uint *)(ray + k * 4 + 0x100);
                    fVar161 = local_440[local_960._0_8_];
                    auVar126._4_4_ = fVar161;
                    auVar126._0_4_ = fVar161;
                    auVar126._8_4_ = fVar161;
                    auVar126._12_4_ = fVar161;
                    local_280._16_4_ = fVar161;
                    local_280._0_16_ = auVar126;
                    local_280._20_4_ = fVar161;
                    local_280._24_4_ = fVar161;
                    local_280._28_4_ = fVar161;
                    uVar123 = *(undefined4 *)((long)&local_420 + local_960._0_8_ * 4);
                    local_260._4_4_ = uVar123;
                    local_260._0_4_ = uVar123;
                    local_260._8_4_ = uVar123;
                    local_260._12_4_ = uVar123;
                    local_260._16_4_ = uVar123;
                    local_260._20_4_ = uVar123;
                    local_260._24_4_ = uVar123;
                    local_260._28_4_ = uVar123;
                    *(undefined4 *)(ray + k * 4 + 0x100) =
                         *(undefined4 *)(local_400 + local_960._0_8_ * 4);
                    fVar160 = 1.0 - fVar161;
                    auVar20 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar126,
                                              ZEXT416(0xc0a00000));
                    auVar15 = vfmadd231ss_fma(ZEXT416((uint)(fVar161 * fVar161 * 3.0)),
                                              ZEXT416((uint)(fVar161 + fVar161)),auVar20);
                    auVar20 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar126,
                                              ZEXT416(0x40000000));
                    auVar20 = vfmadd231ss_fma(ZEXT416((uint)(fVar160 * fVar160 * -3.0)),
                                              ZEXT416((uint)(fVar160 + fVar160)),auVar20);
                    auVar218 = vfnmadd231ss_fma(ZEXT416((uint)(fVar161 * (fVar160 + fVar160))),
                                                ZEXT416((uint)fVar160),ZEXT416((uint)fVar160));
                    auVar125 = vfmadd231ss_fma(ZEXT416((uint)(fVar161 * fVar161)),auVar126,
                                               ZEXT416((uint)(fVar160 * -2.0)));
                    fVar161 = auVar20._0_4_ * 0.5;
                    fVar160 = auVar125._0_4_ * 0.5;
                    auVar191._0_4_ = fVar160 * (float)local_6e0._0_4_;
                    auVar191._4_4_ = fVar160 * (float)local_6e0._4_4_;
                    auVar191._8_4_ = fVar160 * (float)uStack_6d8;
                    auVar191._12_4_ = fVar160 * uStack_6d8._4_4_;
                    auVar164._4_4_ = fVar161;
                    auVar164._0_4_ = fVar161;
                    auVar164._8_4_ = fVar161;
                    auVar164._12_4_ = fVar161;
                    auVar20 = vfmadd132ps_fma(auVar164,auVar191,local_740._0_16_);
                    fVar161 = auVar15._0_4_ * 0.5;
                    auVar192._4_4_ = fVar161;
                    auVar192._0_4_ = fVar161;
                    auVar192._8_4_ = fVar161;
                    auVar192._12_4_ = fVar161;
                    auVar20 = vfmadd132ps_fma(auVar192,auVar20,auVar11);
                    local_7f0.context = context->user;
                    fVar161 = auVar218._0_4_ * 0.5;
                    auVar165._4_4_ = fVar161;
                    auVar165._0_4_ = fVar161;
                    auVar165._8_4_ = fVar161;
                    auVar165._12_4_ = fVar161;
                    auVar15 = vfmadd132ps_fma(auVar165,auVar20,auVar14);
                    local_2e0 = auVar15._0_4_;
                    uStack_2dc = local_2e0;
                    uStack_2d8 = local_2e0;
                    uStack_2d4 = local_2e0;
                    uStack_2d0 = local_2e0;
                    uStack_2cc = local_2e0;
                    uStack_2c8 = local_2e0;
                    uStack_2c4 = local_2e0;
                    auVar20 = vmovshdup_avx(auVar15);
                    auVar186._0_8_ = auVar20._0_8_;
                    auVar186._8_8_ = auVar186._0_8_;
                    auVar189._16_8_ = auVar186._0_8_;
                    auVar189._0_16_ = auVar186;
                    auVar189._24_8_ = auVar186._0_8_;
                    local_2c0 = auVar189;
                    auVar20 = vshufps_avx(auVar15,auVar15,0xaa);
                    auVar166._0_8_ = auVar20._0_8_;
                    auVar166._8_8_ = auVar166._0_8_;
                    auVar179._16_8_ = auVar166._0_8_;
                    auVar179._0_16_ = auVar166;
                    auVar179._24_8_ = auVar166._0_8_;
                    local_2a0 = auVar179;
                    local_240 = CONCAT44(uStack_1bc,local_1c0);
                    uStack_238 = CONCAT44(uStack_1b4,uStack_1b8);
                    uStack_230 = CONCAT44(uStack_1ac,uStack_1b0);
                    uStack_228 = CONCAT44(uStack_1a4,uStack_1a8);
                    local_220 = CONCAT44(uStack_19c,local_1a0);
                    uStack_218 = CONCAT44(uStack_194,uStack_198);
                    uStack_210 = CONCAT44(uStack_18c,uStack_190);
                    uStack_208 = CONCAT44(uStack_184,uStack_188);
                    auVar137 = vpcmpeqd_avx2(local_260,local_260);
                    local_748[1] = auVar137;
                    *local_748 = auVar137;
                    local_200 = (local_7f0.context)->instID[0];
                    uStack_1fc = local_200;
                    uStack_1f8 = local_200;
                    uStack_1f4 = local_200;
                    uStack_1f0 = local_200;
                    uStack_1ec = local_200;
                    uStack_1e8 = local_200;
                    uStack_1e4 = local_200;
                    local_1e0 = (local_7f0.context)->instPrimID[0];
                    uStack_1dc = local_1e0;
                    uStack_1d8 = local_1e0;
                    uStack_1d4 = local_1e0;
                    uStack_1d0 = local_1e0;
                    uStack_1cc = local_1e0;
                    uStack_1c8 = local_1e0;
                    uStack_1c4 = local_1e0;
                    local_660 = local_340._0_8_;
                    uStack_658 = local_340._8_8_;
                    uStack_650 = local_340._16_8_;
                    uStack_648 = local_340._24_8_;
                    local_7f0.valid = (int *)&local_660;
                    local_7f0.geometryUserPtr = pGVar18->userPtr;
                    local_7f0.hit = (RTCHitN *)&local_2e0;
                    local_7f0.N = 8;
                    local_7f0.ray = (RTCRayN *)ray;
                    if (pGVar18->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar179 = ZEXT1632(auVar166);
                      auVar189 = ZEXT1632(auVar186);
                      (*pGVar18->intersectionFilterN)(&local_7f0);
                      auVar221._8_56_ = extraout_var;
                      auVar221._0_8_ = extraout_XMM1_Qa;
                      auVar224 = ZEXT3264(local_7c0);
                      auVar137 = vpcmpeqd_avx2(auVar221._0_32_,auVar221._0_32_);
                    }
                    auVar107._8_8_ = uStack_658;
                    auVar107._0_8_ = local_660;
                    auVar107._16_8_ = uStack_650;
                    auVar107._24_8_ = uStack_648;
                    auVar177 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar107);
                    auVar202 = auVar137 & ~auVar177;
                    if ((((((((auVar202 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                             (auVar202 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar202 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           SUB321(auVar202 >> 0x7f,0) == '\0') &&
                          (auVar202 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                         SUB321(auVar202 >> 0xbf,0) == '\0') &&
                        (auVar202 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                        -1 < auVar202[0x1f]) {
                      auVar177 = auVar177 ^ auVar137;
                      auVar221 = ZEXT3264(CONCAT428(fStack_784,
                                                    CONCAT424(fStack_788,
                                                              CONCAT420(fStack_78c,
                                                                        CONCAT416(fStack_790,
                                                                                  CONCAT412(
                                                  fStack_794,
                                                  CONCAT48(fStack_798,CONCAT44(fStack_79c,local_7a0)
                                                          )))))));
                    }
                    else {
                      p_Var19 = context->args->filter;
                      if ((p_Var19 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar18->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar179 = ZEXT1632(auVar179._0_16_);
                        auVar189 = ZEXT1632(auVar189._0_16_);
                        (*p_Var19)(&local_7f0);
                        auVar224 = ZEXT3264(local_7c0);
                      }
                      auVar108._8_8_ = uStack_658;
                      auVar108._0_8_ = local_660;
                      auVar108._16_8_ = uStack_650;
                      auVar108._24_8_ = uStack_648;
                      auVar202 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar108);
                      auVar137 = vpcmpeqd_avx2(auVar189,auVar189);
                      auVar177 = auVar202 ^ auVar137;
                      auVar24 = vpcmpeqd_avx2(auVar179,auVar179);
                      auVar137 = auVar137 & ~auVar202;
                      auVar221 = ZEXT3264(CONCAT428(fStack_784,
                                                    CONCAT424(fStack_788,
                                                              CONCAT420(fStack_78c,
                                                                        CONCAT416(fStack_790,
                                                                                  CONCAT412(
                                                  fStack_794,
                                                  CONCAT48(fStack_798,CONCAT44(fStack_79c,local_7a0)
                                                          )))))));
                      if ((((((((auVar137 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               || (auVar137 >> 0x3f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) ||
                              (auVar137 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                             || SUB321(auVar137 >> 0x7f,0) != '\0') ||
                            (auVar137 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           SUB321(auVar137 >> 0xbf,0) != '\0') ||
                          (auVar137 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar137[0x1f] < '\0') {
                        auVar202 = auVar202 ^ auVar24;
                        auVar137 = vmaskmovps_avx(auVar202,*(undefined1 (*) [32])local_7f0.hit);
                        *(undefined1 (*) [32])(local_7f0.ray + 0x180) = auVar137;
                        auVar137 = vmaskmovps_avx(auVar202,*(undefined1 (*) [32])
                                                            (local_7f0.hit + 0x20));
                        *(undefined1 (*) [32])(local_7f0.ray + 0x1a0) = auVar137;
                        auVar137 = vmaskmovps_avx(auVar202,*(undefined1 (*) [32])
                                                            (local_7f0.hit + 0x40));
                        *(undefined1 (*) [32])(local_7f0.ray + 0x1c0) = auVar137;
                        auVar137 = vmaskmovps_avx(auVar202,*(undefined1 (*) [32])
                                                            (local_7f0.hit + 0x60));
                        *(undefined1 (*) [32])(local_7f0.ray + 0x1e0) = auVar137;
                        auVar137 = vmaskmovps_avx(auVar202,*(undefined1 (*) [32])
                                                            (local_7f0.hit + 0x80));
                        *(undefined1 (*) [32])(local_7f0.ray + 0x200) = auVar137;
                        auVar137 = vpmaskmovd_avx2(auVar202,*(undefined1 (*) [32])
                                                             (local_7f0.hit + 0xa0));
                        *(undefined1 (*) [32])(local_7f0.ray + 0x220) = auVar137;
                        auVar137 = vpmaskmovd_avx2(auVar202,*(undefined1 (*) [32])
                                                             (local_7f0.hit + 0xc0));
                        *(undefined1 (*) [32])(local_7f0.ray + 0x240) = auVar137;
                        auVar137 = vpmaskmovd_avx2(auVar202,*(undefined1 (*) [32])
                                                             (local_7f0.hit + 0xe0));
                        *(undefined1 (*) [32])(local_7f0.ray + 0x260) = auVar137;
                        auVar137 = vpmaskmovd_avx2(auVar202,*(undefined1 (*) [32])
                                                             (local_7f0.hit + 0x100));
                        *(undefined1 (*) [32])(local_7f0.ray + 0x280) = auVar137;
                      }
                    }
                    auVar137 = local_560;
                    auVar239 = ZEXT464(uVar119);
                    if ((((((((auVar177 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                             (auVar177 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar177 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           SUB321(auVar177 >> 0x7f,0) == '\0') &&
                          (auVar177 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                         SUB321(auVar177 >> 0xbf,0) == '\0') &&
                        (auVar177 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                        -1 < auVar177[0x1f]) {
                      *(uint *)(ray + k * 4 + 0x100) = uVar119;
                    }
                    *(undefined4 *)(local_680 + local_960._0_8_ * 4) = 0;
                    uVar123 = *(undefined4 *)(ray + k * 4 + 0x100);
                    auVar140._4_4_ = uVar123;
                    auVar140._0_4_ = uVar123;
                    auVar140._8_4_ = uVar123;
                    auVar140._12_4_ = uVar123;
                    auVar140._16_4_ = uVar123;
                    auVar140._20_4_ = uVar123;
                    auVar140._24_4_ = uVar123;
                    auVar140._28_4_ = uVar123;
                    auVar177 = vcmpps_avx(auVar137,auVar140,2);
                    auVar202 = vandps_avx(auVar177,local_680);
                    auVar177 = local_680 & auVar177;
                    bVar91 = (auVar177 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                    bVar92 = (auVar177 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                    bVar90 = (auVar177 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                    bVar89 = SUB321(auVar177 >> 0x7f,0) != '\0';
                    bVar88 = (auVar177 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0;
                    bVar87 = SUB321(auVar177 >> 0xbf,0) != '\0';
                    bVar86 = (auVar177 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0;
                    bVar85 = auVar177[0x1f] < '\0';
                    if (((((((bVar91 || bVar92) || bVar90) || bVar89) || bVar88) || bVar87) ||
                        bVar86) || bVar85) {
                      auVar156._8_4_ = 0x7f800000;
                      auVar156._0_8_ = 0x7f8000007f800000;
                      auVar156._12_4_ = 0x7f800000;
                      auVar156._16_4_ = 0x7f800000;
                      auVar156._20_4_ = 0x7f800000;
                      auVar156._24_4_ = 0x7f800000;
                      auVar156._28_4_ = 0x7f800000;
                      auVar137 = vblendvps_avx(auVar156,auVar137,auVar202);
                      auVar177 = vshufps_avx(auVar137,auVar137,0xb1);
                      auVar177 = vminps_avx(auVar137,auVar177);
                      auVar24 = vshufpd_avx(auVar177,auVar177,5);
                      auVar177 = vminps_avx(auVar177,auVar24);
                      auVar24 = vpermpd_avx2(auVar177,0x4e);
                      local_680 = vminps_avx(auVar177,auVar24);
                      auVar177 = vcmpps_avx(auVar137,local_680,0);
                      auVar24 = auVar202 & auVar177;
                      auVar137 = auVar202;
                      if ((((((((auVar24 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               || (auVar24 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               ) || (auVar24 >> 0x5f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) || SUB321(auVar24 >> 0x7f,0) != '\0') ||
                            (auVar24 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           SUB321(auVar24 >> 0xbf,0) != '\0') ||
                          (auVar24 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar24[0x1f] < '\0') {
                        auVar137 = vandps_avx(auVar177,auVar202);
                      }
                      uVar119 = vmovmskps_avx(auVar137);
                      local_960._0_4_ = 0;
                      for (; (uVar119 & 1) == 0; uVar119 = uVar119 >> 1 | 0x80000000) {
                        local_960._0_4_ = local_960._0_4_ + 1;
                      }
                      local_960._4_4_ = 0;
                      local_960._8_24_ = auVar150._8_24_;
                    }
                    auVar181 = ZEXT3264(local_680);
                    local_680 = auVar202;
                  } while (((((((bVar91 || bVar92) || bVar90) || bVar89) || bVar88) || bVar87) ||
                           bVar86) || bVar85);
                }
                auVar216 = ZEXT3264(local_780);
              }
            }
            auVar232 = ZEXT3264(auVar141);
          }
          auVar229 = ZEXT3264(auVar128);
          auVar159 = ZEXT3264(local_720);
          lVar122 = lVar122 + 8;
        } while ((int)lVar122 < iVar116);
      }
      uVar123 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar138._4_4_ = uVar123;
      auVar138._0_4_ = uVar123;
      auVar138._8_4_ = uVar123;
      auVar138._12_4_ = uVar123;
      auVar138._16_4_ = uVar123;
      auVar138._20_4_ = uVar123;
      auVar138._24_4_ = uVar123;
      auVar138._28_4_ = uVar123;
      auVar128 = vcmpps_avx(local_80,auVar138,2);
      uVar115 = vmovmskps_avx(auVar128);
      uVar115 = (uint)uVar121 & uVar115;
    } while (uVar115 != 0);
  }
  return;
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }